

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  undefined8 *puVar1;
  _func_ptls_aead_context_t_ptr_st_ptls_ech_create_opener_t_ptr_ptls_hpke_kem_t_ptr_ptr_ptls_hpke_cipher_suite_t_ptr_ptr_ptls_t_ptr_uint8_t_ptls_hpke_cipher_suite_id_t_ptls_iovec_t_ptls_iovec_t
  *p_Var2;
  st_ptls_ech_create_opener_t *psVar3;
  char *src_00;
  size_t sVar4;
  size_t sVar5;
  ptls_iovec_t ikm;
  ptls_iovec_t raw_message;
  uint8_t uVar6;
  uint32_t uVar7;
  int iVar8;
  void *__dest;
  ptls_iovec_t *ppVar9;
  ptls_aead_context_t *ppVar10;
  size_t sVar11;
  ptls_key_schedule_t *ppVar12;
  uint8_t *puVar13;
  long lVar14;
  size_t len;
  ulong uVar15;
  st_ptls_signature_algorithms_t *signature_algorithms;
  uint8_t *puVar16;
  ptls_iovec_t pVar17;
  ptls_key_exchange_algorithm_t *local_1338;
  byte local_12e9;
  undefined2 *local_12c8;
  uint8_t *local_1268;
  uint8_t *local_1208;
  size_t body_size_34;
  size_t body_size_35;
  size_t body_size_37;
  size_t body_size_38;
  size_t body_size_39;
  ptls_iovec_t name;
  size_t body_start_39;
  size_t capacity_39;
  size_t i;
  size_t body_start_38;
  size_t capacity_38;
  size_t body_start_37;
  size_t capacity_37;
  ulong uStack_1160;
  uint16_t _v_30;
  size_t body_size_36;
  size_t body_start_36;
  size_t capacity_36;
  size_t sStack_1140;
  uint16_t _v_29;
  size_t body_start_35;
  size_t capacity_35;
  ptls_buffer_t *local_1128;
  ptls_buffer_t *sendbuf_3;
  size_t body_start_34;
  size_t capacity_34;
  size_t local_1108;
  size_t mess_start_4;
  ptls_key_schedule_t *_key_sched_4;
  ptls_buffer_t *_buf_4;
  ptls_message_emitter_t *_emitter_4;
  size_t body_size_24;
  size_t body_size_25;
  size_t body_size_33;
  long local_10c8;
  size_t body_start_33;
  size_t capacity_33;
  ulong uStack_10b0;
  uint16_t _v_28;
  size_t body_size_32;
  size_t body_start_32;
  size_t capacity_32;
  ulong uStack_1090;
  uint16_t _v_27;
  size_t body_size_31;
  size_t body_start_31;
  size_t capacity_31;
  ulong uStack_1070;
  uint16_t _v_26;
  size_t body_size_28;
  size_t body_size_29;
  size_t body_size_30;
  size_t body_start_30;
  size_t capacity_30;
  size_t body_start_29;
  size_t capacity_29;
  size_t body_start_28;
  size_t capacity_28;
  ulong uStack_1020;
  uint16_t _v_25;
  size_t body_size_27;
  long local_1010;
  size_t body_start_27;
  size_t capacity_27;
  ulong uStack_ff8;
  uint16_t _v_24;
  size_t body_size_26;
  size_t body_start_26;
  size_t capacity_26;
  long lStack_fd8;
  uint16_t _v_23;
  size_t body_start_25;
  size_t capacity_25;
  ptls_buffer_t *sendbuf_2;
  size_t body_start_24;
  size_t capacity_24;
  size_t local_fa8;
  size_t mess_start_3;
  ptls_key_schedule_t *_key_sched_3;
  ptls_buffer_t *_buf_3;
  ptls_message_emitter_t *_emitter_3;
  ulong local_f78;
  size_t body_size_17;
  size_t body_size_19;
  size_t body_size_23;
  size_t sStack_f58;
  uint16_t _v_22;
  size_t body_start_23;
  size_t capacity_23;
  ulong uStack_f40;
  uint16_t _v_21;
  size_t body_size_21;
  size_t body_size_22;
  size_t body_start_22;
  size_t capacity_22;
  size_t sStack_f18;
  uint16_t _v_20;
  size_t body_start_21;
  size_t capacity_21;
  ptls_buffer_t *ppStack_f00;
  uint16_t _v_19;
  ptls_buffer_t *sendbuf_1;
  size_t body_size_20;
  size_t sStack_ee8;
  uint16_t _v_18;
  size_t body_start_20;
  size_t capacity_20;
  size_t sStack_ed0;
  uint16_t _v_17;
  size_t body_start_19;
  size_t capacity_19;
  ulong uStack_eb8;
  uint16_t _v_16;
  size_t body_size_18;
  size_t body_start_18;
  size_t capacity_18;
  long lStack_e98;
  uint16_t _v_15;
  size_t body_start_17;
  size_t capacity_17;
  size_t local_e80;
  size_t mess_start_2;
  ptls_key_schedule_t *_key_sched_2;
  ptls_buffer_t *_buf_2;
  ptls_message_emitter_t *_emitter_2;
  size_t sh_start_off_2;
  size_t ech_confirm_off_1;
  undefined8 *puStack_e48;
  uint8_t max_tickets;
  ptls_iovec_t *selected;
  ptls_iovec_t local_e30;
  ptls_iovec_t local_e20;
  ulong local_e10;
  size_t body_size_6;
  size_t body_size_8;
  size_t body_size_12;
  size_t body_size_13;
  size_t body_size_16;
  size_t local_dd8;
  size_t sz_1;
  size_t body_start_16;
  size_t capacity_16;
  size_t tbs_len;
  size_t body_size_14;
  ulong local_da8;
  size_t body_size_15;
  size_t sz;
  size_t body_start_15;
  size_t capacity_15;
  size_t body_start_14;
  size_t capacity_14;
  size_t tbs_start;
  size_t body_start_13;
  size_t capacity_13;
  size_t body_start_12;
  size_t capacity_12;
  ulong uStack_d48;
  uint16_t _v_14;
  size_t body_size_11;
  size_t body_start_11;
  size_t capacity_11;
  ptls_buffer_t *ppStack_d28;
  uint16_t _v_13;
  ptls_buffer_t *sendbuf;
  size_t body_size_10;
  size_t sStack_d10;
  uint16_t _v_12;
  size_t body_start_10;
  size_t capacity_10;
  ptls_key_exchange_algorithm_t *ppStack_cf8;
  uint16_t _v_11;
  ptls_key_exchange_algorithm_t *_negotiated_group_1;
  size_t body_size_9;
  size_t sStack_ce0;
  uint16_t _v_10;
  size_t body_start_9;
  size_t capacity_9;
  size_t sStack_cc8;
  uint16_t _v_9;
  size_t body_start_8;
  size_t capacity_8;
  ulong uStack_cb0;
  uint16_t _v_8;
  size_t body_size_7;
  size_t body_start_7;
  size_t capacity_7;
  long lStack_c90;
  uint16_t _v_7;
  size_t body_start_6;
  size_t capacity_6;
  size_t local_c78;
  size_t mess_start_1;
  ptls_key_schedule_t *_key_sched_1;
  ptls_buffer_t *_buf_1;
  ptls_message_emitter_t *_emitter_1;
  size_t sh_start_off_1;
  size_t ech_confirm_off;
  ptls_key_exchange_algorithm_t *ppStack_c40;
  int retry_uses_cookie;
  ptls_key_exchange_algorithm_t *negotiated_group;
  size_t body_size;
  size_t body_size_2;
  size_t body_size_5;
  size_t body_start_5;
  size_t capacity_5;
  ulong uStack_c08;
  uint16_t _v_6;
  size_t body_size_4;
  size_t sStack_bf8;
  uint16_t _v_5;
  size_t body_start_4;
  size_t capacity_4;
  undefined2 *puStack_be0;
  uint16_t _v_4;
  ptls_key_exchange_algorithm_t *_negotiated_group;
  size_t body_size_3;
  size_t sStack_bc8;
  uint16_t _v_3;
  size_t body_start_3;
  size_t capacity_3;
  size_t sStack_bb0;
  uint16_t _v_2;
  size_t body_start_2;
  size_t capacity_2;
  ulong uStack_b98;
  uint16_t _v_1;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  long lStack_b78;
  uint16_t _v;
  size_t body_start;
  size_t capacity;
  size_t local_b60;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  size_t sh_start_off;
  size_t hrr_start;
  size_t sigsize;
  uint8_t sig [64];
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint8_t *end;
  uint8_t *src;
  ptls_cipher_suite_t *cs;
  size_t l;
  ptls_iovec_t server_name;
  undefined1 auStack_778 [416];
  ptls_iovec_t local_5d8;
  int local_5c4;
  ptls_log_conn_state_t *ppStack_5c0;
  int ptlslog_include_appdata;
  ptls_log_conn_state_t *conn_state;
  ptls_t *_tls;
  undefined1 auStack_5a8 [4];
  uint32_t active;
  undefined1 local_598 [784];
  undefined1 auStack_288 [420];
  int local_e4;
  uint local_e0;
  int ret;
  int is_second_flight;
  int accept_early_data;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  size_t psk_index;
  uint8_t *puStack_a8;
  anon_enum_32 mode;
  anon_struct_48_3_8775e58a ech;
  anon_struct_24_2_cc7b932a key_share;
  st_ptls_client_hello_t *ch;
  ptls_handshake_properties_t *properties_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.base = (uint8_t *)message.len;
  tls_local = (ptls_t *)message.base;
  memset(&ech.ch_inner.is_allocated,0,0x18);
  memset(&stack0xffffffffffffff58,0,0x30);
  pubkey.len = 0xffffffffffffffff;
  memset(&ecdh_secret.len,0,0x10);
  memset(&is_second_flight,0,0x10);
  ret = 0;
  local_e0 = (uint)(tls->state == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO);
  ptls_buffer_init((ptls_buffer_t *)&ech.ch_outer_aad,"",0);
  __dest = malloc(0x4b0);
  key_share.peer_key.len = (size_t)__dest;
  if (__dest == (void *)0x0) {
    local_e4 = 0x201;
  }
  else {
    memset(local_598,0,0x4b0);
    memcpy(auStack_288,&DAT_0013e2f8,0x198);
    memcpy(__dest,local_598,0x4b0);
    local_e4 = decode_client_hello(tls->ctx,(st_ptls_client_hello_t *)key_share.peer_key.len,
                                   (uint8_t *)((long)&tls_local->ctx + 4),
                                   message_local.base +
                                   (long)(&tls_local->traffic_protection + -1) + 0x78,properties,tls
                                  );
    if (local_e4 == 0) {
      if (local_e0 == 0) {
        local_1208 = (uint8_t *)0x0;
      }
      else {
        local_1208 = tls->client_random;
      }
      local_e4 = check_client_hello_constraints
                           (tls->ctx,(st_ptls_client_hello_t *)key_share.peer_key.len,local_1208,0,
                            message,tls);
      if (local_e4 == 0) {
        if (local_e0 == 0) {
          puVar1 = *(undefined8 **)(key_share.peer_key.len + 8);
          *(undefined8 *)tls->client_random = *puVar1;
          *(undefined8 *)(tls->client_random + 8) = puVar1[1];
          *(undefined8 *)(tls->client_random + 0x10) = puVar1[2];
          *(undefined8 *)(tls->client_random + 0x18) = puVar1[3];
          log_client_random(tls);
        }
        else if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
          if (*(long *)(key_share.peer_key.len + 0x248) == 0) {
            local_e4 = 0x6d;
            goto LAB_0013504b;
          }
          if ((((*(uint8_t *)(key_share.peer_key.len + 0x231) != (tls->ech).config_id) ||
               (*(uint16_t *)(key_share.peer_key.len + 0x232) != (((tls->ech).cipher)->id).kdf)) ||
              (*(uint16_t *)(key_share.peer_key.len + 0x234) != (((tls->ech).cipher)->id).aead)) ||
             (*(long *)(key_share.peer_key.len + 0x240) != 0)) {
            local_e4 = 0x2f;
            goto LAB_0013504b;
          }
        }
        sVar11 = key_share.peer_key.len;
        if (*(long *)(key_share.peer_key.len + 0x248) == 0) {
          if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x1) !=
              (undefined1  [112])0x0) {
            if (local_e0 == 0) {
              __assert_fail("is_second_flight",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                            ,0x1162,
                            "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                           );
            }
            local_e4 = 0x2f;
            goto LAB_0013504b;
          }
        }
        else {
          if (*(char *)(key_share.peer_key.len + 0x230) != '\0') {
            local_e4 = 0x2f;
            goto LAB_0013504b;
          }
          if (((local_e0 == 0) &&
              (*(byte *)&tls->ech = *(byte *)&tls->ech & 0xfe | 1,
              *(long *)(key_share.peer_key.len + 0x248) != 0)) &&
             ((tls->ctx->ech).server.create_opener != (ptls_ech_create_opener_t *)0x0)) {
            p_Var2 = ((tls->ctx->ech).server.create_opener)->cb;
            psVar3 = (tls->ctx->ech).server.create_opener;
            uVar6 = *(uint8_t *)(key_share.peer_key.len + 0x231);
            ppVar9 = (ptls_iovec_t *)(key_share.peer_key.len + 0x238);
            _auStack_5a8 = ptls_iovec_init("tls ech",8);
            ppVar10 = (*p_Var2)(psVar3,&(tls->ech).kem,&(tls->ech).cipher,tls,uVar6,
                                *(ptls_hpke_cipher_suite_id_t *)(sVar11 + 0x232),*ppVar9,
                                _auStack_5a8);
            (tls->ech).aead = ppVar10;
            if (ppVar10 != (ptls_aead_context_t *)0x0) {
              (tls->ech).config_id = *(uint8_t *)(key_share.peer_key.len + 0x231);
            }
          }
          if (local_e0 == 0) {
            _tls._4_4_ = ptls_log_point_maybe_active(&server_handle_hello::logpoint);
            if (_tls._4_4_ == 0) {
              _tls._4_4_ = 0;
            }
            else {
              conn_state = (ptls_log_conn_state_t *)tls;
              ppStack_5c0 = ptls_get_log_state(tls);
              uVar7 = ptls_log_conn_maybe_active(ppStack_5c0,ptls_get_server_name,conn_state);
              _tls._4_4_ = uVar7 & _tls._4_4_;
              if (_tls._4_4_ != 0) {
                local_5c4 = 0;
                do {
                  ptls_log__do_write_start(&server_handle_hello::logpoint,1);
                  ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)conn_state);
                  ptls_log__do_push_element_bool
                            (",\"is_ech\":",10,(uint)((tls->ech).aead != (ptls_aead_context_t *)0x0)
                            );
                  local_5c4 = ptls_log__do_write_end
                                        (&server_handle_hello::logpoint,ppStack_5c0,
                                         ptls_get_server_name,conn_state,local_5c4);
                } while (local_5c4 != 0);
                local_5c4 = 0;
              }
            }
          }
          if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
            puStack_a8 = (uint8_t *)
                         malloc(*(long *)(key_share.peer_key.len + 0x250) -
                                ((tls->ech).aead)->algo->tag_size);
            if ((puStack_a8 == (uint8_t *)0x0) ||
               (ech.encoded_ch_inner = (uint8_t *)malloc((size_t)(message_local.base + -4)),
               ech.encoded_ch_inner == (uint8_t *)0x0)) {
              local_e4 = 0x201;
              goto LAB_0013504b;
            }
            memcpy(ech.encoded_ch_inner,(uint8_t *)((long)&tls_local->ctx + 4),
                   (size_t)(message_local.base + -4));
            memset(ech.encoded_ch_inner +
                   (*(long *)(key_share.peer_key.len + 0x248) - (long)((long)&tls_local->ctx + 4)),0
                   ,*(size_t *)(key_share.peer_key.len + 0x250));
            sVar11 = ptls_aead_decrypt((tls->ech).aead,puStack_a8,
                                       *(void **)(key_share.peer_key.len + 0x248),
                                       *(size_t *)(key_share.peer_key.len + 0x250),
                                       (long)(int)local_e0,ech.encoded_ch_inner,
                                       (size_t)(message_local.base + -4));
            if (sVar11 == 0xffffffffffffffff) {
              if (local_e0 != 0) {
                local_e4 = 0x33;
                goto LAB_0013504b;
              }
              ptls_aead_free((tls->ech).aead);
              (tls->ech).aead = (ptls_aead_context_t *)0x0;
            }
            else {
              *(byte *)&tls->ech = *(byte *)&tls->ech & 0xfb | 4;
              local_e4 = rebuild_ch_inner((ptls_buffer_t *)&ech.ch_outer_aad,puStack_a8,
                                          puStack_a8 +
                                          (*(long *)(key_share.peer_key.len + 0x250) -
                                          ((tls->ech).aead)->algo->tag_size),
                                          (st_ptls_client_hello_t *)key_share.peer_key.len,
                                          (tls_local->traffic_protection).dec.secret +
                                          *(long *)(key_share.peer_key.len + 0x4a8) + -0x54,
                                          message_local.base +
                                          (long)(&tls_local->traffic_protection + -1) + 0x78);
              if (local_e4 != 0) goto LAB_0013504b;
              pVar17 = ptls_iovec_init(ech.ch_outer_aad,ech.ch_inner.capacity);
              sVar11 = key_share.peer_key.len;
              local_5d8.base = pVar17.base;
              tls_local = (ptls_t *)local_5d8.base;
              local_5d8.len = pVar17.len;
              message_local.base = (uint8_t *)local_5d8.len;
              local_5d8 = pVar17;
              memset(&server_name.len,0,0x4b0);
              memcpy(auStack_778,&DAT_0013e490,0x198);
              memcpy((void *)sVar11,&server_name.len,0x4b0);
              local_e4 = decode_client_hello(tls->ctx,(st_ptls_client_hello_t *)
                                                      key_share.peer_key.len,ech.ch_outer_aad + 4,
                                             ech.ch_outer_aad + ech.ch_inner.capacity,properties,tls
                                            );
              if (local_e4 != 0) goto LAB_0013504b;
              if (local_e0 == 0) {
                local_1268 = (uint8_t *)0x0;
              }
              else {
                local_1268 = (tls->ech).inner_client_random;
              }
              local_e4 = check_client_hello_constraints
                                   (tls->ctx,(st_ptls_client_hello_t *)key_share.peer_key.len,
                                    local_1268,1,pVar17,tls);
              if (local_e4 != 0) goto LAB_0013504b;
              if (local_e0 == 0) {
                puVar1 = *(undefined8 **)(key_share.peer_key.len + 8);
                *(undefined8 *)(tls->ech).inner_client_random = *puVar1;
                *(undefined8 *)((tls->ech).inner_client_random + 8) = puVar1[1];
                *(undefined8 *)((tls->ech).inner_client_random + 0x10) = puVar1[2];
                *(undefined8 *)((tls->ech).inner_client_random + 0x18) = puVar1[3];
              }
              local_e4 = 0;
            }
          }
        }
        if ((tls->ctx->field_0xb8 & 1) != 0) {
          *(uint *)(key_share.peer_key.len + 0x308) =
               *(uint *)(key_share.peer_key.len + 0x308) & 0xfffffffe;
        }
        if (local_e0 == 0) {
          if (*(long *)(key_share.peer_key.len + 0x18) != 0) {
            tls->field_0x1e8 = tls->field_0x1e8 & 0xfb | 4;
          }
          memset(&l,0,0x10);
          if (*(long *)(key_share.peer_key.len + 0x90) != 0) {
            l = *(size_t *)(key_share.peer_key.len + 0x90);
            server_name.base = *(uint8_t **)(key_share.peer_key.len + 0x98);
          }
          pVar17.len = (size_t)server_name.base;
          pVar17.base = (uint8_t *)l;
          raw_message.len = (size_t)message_local.base;
          raw_message.base = (uint8_t *)tls_local;
          local_e4 = call_on_client_hello_cb
                               (tls,pVar17,raw_message,
                                *(ptls_iovec_t *)(key_share.peer_key.len + 0x38),
                                (ptls_iovec_t *)(key_share.peer_key.len + 0xa0),
                                *(size_t *)(key_share.peer_key.len + 0x1a0),
                                (uint16_t *)(key_share.peer_key.len + 0x68),
                                *(size_t *)(key_share.peer_key.len + 0x88),
                                (uint16_t *)(key_share.peer_key.len + 0x1a8),
                                *(size_t *)(key_share.peer_key.len + 0x1c8),
                                (uint8_t *)(key_share.peer_key.len + 0x218),
                                *(size_t *)(key_share.peer_key.len + 0x220),
                                (ptls_client_hello_psk_identity_t *)(key_share.peer_key.len + 0x260)
                                ,*(size_t *)(key_share.peer_key.len + 0x300),0);
          if (local_e4 != 0) goto LAB_0013504b;
          uVar6 = '\0';
          if (((byte)tls->ctx->field_0xb8 >> 5 & 1) != 0) {
            uVar6 = '\x02';
          }
          iVar8 = certificate_type_exists
                            ((uint8_t *)(key_share.peer_key.len + 0x218),
                             *(size_t *)(key_share.peer_key.len + 0x220),uVar6);
          if (iVar8 == 0) {
            local_e4 = 0x2b;
            goto LAB_0013504b;
          }
        }
        else {
          if ((*(byte *)(key_share.peer_key.len + 0x30c) & 1) != 0) {
            local_e4 = 0x32;
            goto LAB_0013504b;
          }
          if ((tls->server_name != (char *)0x0) &&
             ((cs = (ptls_cipher_suite_t *)strlen(tls->server_name),
              *(ptls_cipher_suite_t **)(key_share.peer_key.len + 0x98) != cs ||
              (iVar8 = memcmp(*(void **)(key_share.peer_key.len + 0x90),tls->server_name,(size_t)cs)
              , iVar8 != 0)))) {
            local_e4 = 0x28;
            goto LAB_0013504b;
          }
        }
        local_e4 = select_cipher((ptls_cipher_suite_t **)&src,tls->ctx->cipher_suites,
                                 *(uint8_t **)(key_share.peer_key.len + 0x38),
                                 (uint8_t *)
                                 (*(long *)(key_share.peer_key.len + 0x38) +
                                 *(long *)(key_share.peer_key.len + 0x40)),
                                 (uint)((byte)tls->ctx->field_0xb8 >> 6 & 1),
                                 (uint)((byte)tls->ctx->field_0xb8 >> 7),
                                 (tls->ctx->pre_shared_key).hash);
        if (local_e4 == 0) {
          if (local_e0 == 0) {
            tls->cipher_suite = (ptls_cipher_suite_t *)src;
            ppVar12 = key_schedule_new((ptls_cipher_suite_t *)src,(ptls_cipher_suite_t **)0x0,0);
            tls->key_schedule = ppVar12;
            if (ppVar12 == (ptls_key_schedule_t *)0x0) {
              local_e4 = 0x201;
              goto LAB_0013504b;
            }
          }
          else if (tls->cipher_suite != (ptls_cipher_suite_t *)src) {
            local_e4 = 0x28;
            goto LAB_0013504b;
          }
          if (((ech.ch_inner._24_8_ == 0) && (*(long *)(key_share.peer_key.len + 0x58) != 0)) &&
             (tls->ctx->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) {
            end = *(uint8_t **)(key_share.peer_key.len + 0x58);
            puVar13 = end + *(long *)(key_share.peer_key.len + 0x60);
            _block_size = 2;
            if ((ulong)((long)puVar13 - (long)end) < 2) {
              local_e4 = 0x32;
              goto LAB_0013504b;
            }
            _block_size64 = 0;
            do {
              puVar16 = end + 1;
              _block_size64 = _block_size64 << 8 | (ulong)*end;
              _block_size = _block_size - 1;
              end = puVar16;
            } while (_block_size != 0);
            if ((ulong)((long)puVar13 - (long)puVar16) < _block_size64) {
              local_e4 = 0x32;
              goto LAB_0013504b;
            }
            local_e4 = select_key_share((ptls_key_exchange_algorithm_t **)&ech.ch_inner.is_allocated
                                        ,(ptls_iovec_t *)&key_share,tls->ctx->key_exchanges,&end,
                                        puVar16 + _block_size64,0);
            if (local_e4 != 0) goto LAB_0013504b;
            if (end != puVar16 + _block_size64) {
              local_e4 = 0x32;
              goto LAB_0013504b;
            }
            if (end != puVar13) {
              local_e4 = 0x32;
              goto LAB_0013504b;
            }
            local_e4 = 0;
          }
          if (local_e0 == 0) {
            if ((*(long *)(key_share.peer_key.len + 0x1d8) == 0) || (ech.ch_inner._24_8_ == 0)) {
              if (((*(long *)(key_share.peer_key.len + 0x58) != 0) &&
                  (tls->ctx->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) &&
                 ((ech.ch_inner._24_8_ == 0 ||
                  ((properties != (ptls_handshake_properties_t *)0x0 &&
                   ((*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0)))))) {
                if (*(long *)(key_share.peer_key.len + 0x48) == 0) {
                  local_e4 = 0x6d;
                }
                else {
                  local_e4 = select_negotiated_group
                                       (&stack0xfffffffffffff3c0,tls->ctx->key_exchanges,
                                        *(uint8_t **)(key_share.peer_key.len + 0x48),
                                        (uint8_t *)
                                        (*(long *)(key_share.peer_key.len + 0x48) +
                                        *(long *)(key_share.peer_key.len + 0x50)));
                  if (local_e4 == 0) {
                    ptls__key_schedule_update_hash
                              (tls->key_schedule,(uint8_t *)tls_local,(size_t)message_local.base,0);
                    if (tls->key_schedule->generation != 0) {
                      __assert_fail("tls->key_schedule->generation == 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                    ,0x11d5,
                                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                   );
                    }
                    local_12e9 = 0;
                    if ((properties != (ptls_handshake_properties_t *)0x0) &&
                       (local_12e9 = 0, (*(byte *)((long)&properties->field_0 + 0x60) >> 1 & 1) != 0
                       )) {
                      iVar8 = ptls_is_ech_handshake
                                        (tls,(uint8_t *)0x0,(ptls_hpke_kem_t **)0x0,
                                         (ptls_hpke_cipher_suite_t **)0x0);
                      local_12e9 = iVar8 != 0 ^ 0xff;
                    }
                    ech_confirm_off._4_4_ = (uint)(local_12e9 & 1);
                    if (ech_confirm_off._4_4_ == 0) {
                      key_schedule_transform_post_ch1hash(tls->key_schedule);
                      key_schedule_extract(tls->key_schedule,(tls->ctx->pre_shared_key).secret);
                    }
                    sh_start_off_1 = 0;
                    _buf_1 = (ptls_buffer_t *)emitter;
                    local_e4 = (*emitter->begin_message)(emitter);
                    if (local_e4 == 0) {
                      _key_sched_1 = (ptls_key_schedule_t *)_buf_1->base;
                      mess_start_1 = 0;
                      local_c78 = *(size_t *)(_key_sched_1->secret + 0xc);
                      capacity_6._7_1_ = 2;
                      local_e4 = ptls_buffer__do_pushv
                                           ((ptls_buffer_t *)_key_sched_1,
                                            (void *)((long)&capacity_6 + 7),1);
                      if (local_e4 == 0) {
                        body_start_6 = 3;
                        local_e4 = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_1,"",3);
                        if (local_e4 == 0) {
                          lStack_c90 = *(long *)(_key_sched_1->secret + 0xc);
                          _emitter_1 = (ptls_message_emitter_t *)(emitter->buf->off - 4);
                          capacity_7._6_2_ = 0x303;
                          capacity_7._4_1_ = 3;
                          capacity_7._5_1_ = 3;
                          local_e4 = ptls_buffer__do_pushv
                                               (emitter->buf,(void *)((long)&capacity_7 + 4),2);
                          if ((local_e4 == 0) &&
                             (local_e4 = ptls_buffer_reserve(emitter->buf,0x20), local_e4 == 0)) {
                            puVar16 = emitter->buf->base;
                            sVar11 = emitter->buf->off;
                            puVar13 = puVar16 + sVar11;
                            puVar13[0] = 0xcf;
                            puVar13[1] = '!';
                            puVar13[2] = 0xad;
                            puVar13[3] = 't';
                            puVar13[4] = 0xe5;
                            puVar13[5] = 0x9a;
                            puVar13[6] = 'a';
                            puVar13[7] = '\x11';
                            puVar13 = puVar16 + sVar11 + 8;
                            puVar13[0] = 0xbe;
                            puVar13[1] = '\x1d';
                            puVar13[2] = 0x8c;
                            puVar13[3] = '\x02';
                            puVar13[4] = '\x1e';
                            puVar13[5] = 'e';
                            puVar13[6] = 0xb8;
                            puVar13[7] = 0x91;
                            puVar13 = puVar16 + sVar11 + 0x10;
                            puVar13[0] = 0xc2;
                            puVar13[1] = 0xa2;
                            puVar13[2] = '\x11';
                            puVar13[3] = '\x16';
                            puVar13[4] = 'z';
                            puVar13[5] = 0xbb;
                            puVar13[6] = 0x8c;
                            puVar13[7] = '^';
                            puVar16 = puVar16 + sVar11 + 0x18;
                            puVar16[0] = '\a';
                            puVar16[1] = 0x9e;
                            puVar16[2] = '\t';
                            puVar16[3] = 0xe2;
                            puVar16[4] = 200;
                            puVar16[5] = 0xa8;
                            puVar16[6] = '3';
                            puVar16[7] = 0x9c;
                            emitter->buf->off = emitter->buf->off + 0x20;
                            body_start_7 = 1;
                            local_e4 = ptls_buffer__do_pushv(emitter->buf,"",1);
                            if (local_e4 == 0) {
                              body_size_7 = emitter->buf->off;
                              local_e4 = ptls_buffer__do_pushv
                                                   (emitter->buf,
                                                    *(void **)(key_share.peer_key.len + 0x10),
                                                    *(size_t *)(key_share.peer_key.len + 0x18));
                              if (local_e4 == 0) {
                                uStack_cb0 = emitter->buf->off - body_size_7;
                                if (body_start_7 == 0xffffffffffffffff) {
                                  local_e4 = ptls_buffer__adjust_quic_blocksize
                                                       (emitter->buf,uStack_cb0);
                                  if (local_e4 != 0) goto LAB_0013504b;
                                }
                                else {
                                  if ((body_start_7 < 8) &&
                                     ((ulong)(1L << ((byte)(body_start_7 << 3) & 0x3f)) <=
                                      uStack_cb0)) {
                                    local_e4 = 0x20c;
                                    goto LAB_0013504b;
                                  }
                                  for (; body_start_7 != 0; body_start_7 = body_start_7 - 1) {
                                    emitter->buf->base[body_size_7 - body_start_7] =
                                         (uint8_t)(uStack_cb0 >>
                                                  (((char)body_start_7 + -1) * '\b' & 0x3fU));
                                  }
                                }
                                local_e4 = 0;
                                capacity_8._6_2_ = tls->cipher_suite->id;
                                capacity_8._4_1_ = (undefined1)(capacity_8._6_2_ >> 8);
                                capacity_8._5_1_ = (undefined1)capacity_8._6_2_;
                                local_e4 = ptls_buffer__do_pushv
                                                     (emitter->buf,(void *)((long)&capacity_8 + 4),2
                                                     );
                                if (local_e4 == 0) {
                                  capacity_8._3_1_ = 0;
                                  local_e4 = ptls_buffer__do_pushv
                                                       (emitter->buf,(void *)((long)&capacity_8 + 3)
                                                        ,1);
                                  if (local_e4 == 0) {
                                    body_start_8 = 2;
                                    local_e4 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                    if (local_e4 == 0) {
                                      sStack_cc8 = emitter->buf->off;
                                      capacity_9._6_2_ = 0x2b;
                                      capacity_9._4_1_ = 0;
                                      capacity_9._5_1_ = 0x2b;
                                      local_e4 = ptls_buffer__do_pushv
                                                           (emitter->buf,
                                                            (void *)((long)&capacity_9 + 4),2);
                                      if (local_e4 == 0) {
                                        body_start_9 = 2;
                                        local_e4 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                        if (local_e4 == 0) {
                                          sStack_ce0 = emitter->buf->off;
                                          body_size_9._6_2_ =
                                               *(undefined2 *)(key_share.peer_key.len + 0x30);
                                          body_size_9._4_1_ =
                                               (undefined1)((ushort)body_size_9._6_2_ >> 8);
                                          body_size_9._5_1_ = (undefined1)body_size_9._6_2_;
                                          local_e4 = ptls_buffer__do_pushv
                                                               (emitter->buf,
                                                                (void *)((long)&body_size_9 + 4),2);
                                          if (local_e4 == 0) {
                                            _negotiated_group_1 =
                                                 (ptls_key_exchange_algorithm_t *)
                                                 (emitter->buf->off - sStack_ce0);
                                            if (body_start_9 == 0xffffffffffffffff) {
                                              local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                   (emitter->buf,
                                                                    (size_t)_negotiated_group_1);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                            }
                                            else {
                                              if ((body_start_9 < 8) &&
                                                 ((ptls_key_exchange_algorithm_t *)
                                                  (1L << ((byte)(body_start_9 << 3) & 0x3f)) <=
                                                  _negotiated_group_1)) {
                                                local_e4 = 0x20c;
                                                goto LAB_0013504b;
                                              }
                                              for (; body_start_9 != 0;
                                                  body_start_9 = body_start_9 - 1) {
                                                emitter->buf->base[sStack_ce0 - body_start_9] =
                                                     (uint8_t)((ulong)_negotiated_group_1 >>
                                                              (((char)body_start_9 + -1) * '\b' &
                                                              0x3fU));
                                              }
                                            }
                                            local_e4 = 0;
                                            if (ech.ch_inner._24_8_ == 0) {
                                              local_1338 = ppStack_c40;
                                            }
                                            else {
                                              local_1338 = (ptls_key_exchange_algorithm_t *)0x0;
                                            }
                                            ppStack_cf8 = local_1338;
                                            if (local_1338 != (ptls_key_exchange_algorithm_t *)0x0)
                                            {
                                              capacity_10._6_2_ = 0x33;
                                              capacity_10._4_1_ = 0;
                                              capacity_10._5_1_ = 0x33;
                                              local_e4 = ptls_buffer__do_pushv
                                                                   (emitter->buf,
                                                                    (void *)((long)&capacity_10 + 4)
                                                                    ,2);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              body_start_10 = 2;
                                              local_e4 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              sStack_d10 = emitter->buf->off;
                                              body_size_10._6_2_ = ppStack_cf8->id;
                                              body_size_10._4_1_ =
                                                   (undefined1)(body_size_10._6_2_ >> 8);
                                              body_size_10._5_1_ = (undefined1)body_size_10._6_2_;
                                              local_e4 = ptls_buffer__do_pushv
                                                                   (emitter->buf,
                                                                    (void *)((long)&body_size_10 + 4
                                                                            ),2);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              sendbuf = (ptls_buffer_t *)
                                                        (emitter->buf->off - sStack_d10);
                                              if (body_start_10 == 0xffffffffffffffff) {
                                                local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                     (emitter->buf,(size_t)sendbuf);
                                                if (local_e4 != 0) goto LAB_0013504b;
                                              }
                                              else {
                                                if ((body_start_10 < 8) &&
                                                   ((ptls_buffer_t *)
                                                    (1L << ((byte)(body_start_10 << 3) & 0x3f)) <=
                                                    sendbuf)) {
                                                  local_e4 = 0x20c;
                                                  goto LAB_0013504b;
                                                }
                                                for (; body_start_10 != 0;
                                                    body_start_10 = body_start_10 - 1) {
                                                  emitter->buf->base[sStack_d10 - body_start_10] =
                                                       (uint8_t)((ulong)sendbuf >>
                                                                (((char)body_start_10 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                              }
                                            }
                                            local_e4 = 0;
                                            ppStack_d28 = emitter->buf;
                                            iVar8 = ptls_is_ech_handshake
                                                              (tls,(uint8_t *)0x0,
                                                               (ptls_hpke_kem_t **)0x0,
                                                               (ptls_hpke_cipher_suite_t **)0x0);
                                            if (iVar8 != 0) {
                                              capacity_11._6_2_ = 0xfe0d;
                                              capacity_11._4_1_ = 0xfe;
                                              capacity_11._5_1_ = 0xd;
                                              local_e4 = ptls_buffer__do_pushv
                                                                   (ppStack_d28,
                                                                    (void *)((long)&capacity_11 + 4)
                                                                    ,2);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              body_start_11 = 2;
                                              local_e4 = ptls_buffer__do_pushv(ppStack_d28,"",2);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              body_size_11 = ppStack_d28->off;
                                              local_e4 = ptls_buffer_reserve(ppStack_d28,8);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              memset(ppStack_d28->base + ppStack_d28->off,0,8);
                                              sh_start_off_1 = ppStack_d28->off;
                                              ppStack_d28->off = ppStack_d28->off + 8;
                                              uStack_d48 = ppStack_d28->off - body_size_11;
                                              if (body_start_11 == 0xffffffffffffffff) {
                                                local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                     (ppStack_d28,uStack_d48);
                                                if (local_e4 != 0) goto LAB_0013504b;
                                                local_e4 = 0;
                                              }
                                              else {
                                                if ((body_start_11 < 8) &&
                                                   ((ulong)(1L << ((byte)(body_start_11 << 3) & 0x3f
                                                                  )) <= uStack_d48)) {
                                                  local_e4 = 0x20c;
                                                  goto LAB_0013504b;
                                                }
                                                for (; body_start_11 != 0;
                                                    body_start_11 = body_start_11 - 1) {
                                                  ppStack_d28->base[body_size_11 - body_start_11] =
                                                       (uint8_t)(uStack_d48 >>
                                                                (((char)body_start_11 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                              }
                                            }
                                            if (ech_confirm_off._4_4_ != 0) {
                                              capacity_12._6_2_ = 0x2c;
                                              capacity_12._4_1_ = 0;
                                              capacity_12._5_1_ = 0x2c;
                                              local_e4 = ptls_buffer__do_pushv
                                                                   (ppStack_d28,
                                                                    (void *)((long)&capacity_12 + 4)
                                                                    ,2);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              body_start_12 = 2;
                                              local_e4 = ptls_buffer__do_pushv(ppStack_d28,"",2);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              capacity_13 = ppStack_d28->off;
                                              body_start_13 = 2;
                                              local_e4 = ptls_buffer__do_pushv(ppStack_d28,"",2);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              tbs_start = ppStack_d28->off;
                                              capacity_14 = ppStack_d28->off;
                                              body_start_14 = 2;
                                              local_e4 = ptls_buffer__do_pushv(ppStack_d28,"",2);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              capacity_15 = ppStack_d28->off;
                                              body_start_15 = 1;
                                              local_e4 = ptls_buffer__do_pushv(ppStack_d28,"",1);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              sz = ppStack_d28->off;
                                              body_size_15 = tls->cipher_suite->hash->digest_size;
                                              local_e4 = ptls_buffer_reserve(ppStack_d28,
                                                                             body_size_15);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              key_schedule_extract_ch1hash
                                                        (tls->key_schedule,
                                                         ppStack_d28->base + ppStack_d28->off);
                                              ppStack_d28->off = body_size_15 + ppStack_d28->off;
                                              local_da8 = ppStack_d28->off - sz;
                                              if (body_start_15 == 0xffffffffffffffff) {
                                                local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                     (ppStack_d28,local_da8);
                                                if (local_e4 != 0) goto LAB_0013504b;
                                                local_e4 = 0;
                                              }
                                              else {
                                                if ((body_start_15 < 8) &&
                                                   ((ulong)(1L << ((byte)(body_start_15 << 3) & 0x3f
                                                                  )) <= local_da8)) {
                                                  local_e4 = 0x20c;
                                                  goto LAB_0013504b;
                                                }
                                                for (; body_start_15 != 0;
                                                    body_start_15 = body_start_15 - 1) {
                                                  ppStack_d28->base[sz - body_start_15] =
                                                       (uint8_t)(local_da8 >>
                                                                (((char)body_start_15 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                              }
                                              body_size_14._7_1_ = ech.ch_inner._24_8_ == 0;
                                              local_e4 = ptls_buffer__do_pushv
                                                                   (ppStack_d28,
                                                                    (void *)((long)&body_size_14 + 7
                                                                            ),1);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              tbs_len = ppStack_d28->off - capacity_15;
                                              if (body_start_14 == 0xffffffffffffffff) {
                                                local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                     (ppStack_d28,tbs_len);
                                                if (local_e4 != 0) goto LAB_0013504b;
                                              }
                                              else {
                                                if ((body_start_14 < 8) &&
                                                   ((ulong)(1L << ((byte)(body_start_14 << 3) & 0x3f
                                                                  )) <= tbs_len)) {
                                                  local_e4 = 0x20c;
                                                  goto LAB_0013504b;
                                                }
                                                for (; body_start_14 != 0;
                                                    body_start_14 = body_start_14 - 1) {
                                                  ppStack_d28->base[capacity_15 - body_start_14] =
                                                       (uint8_t)(tbs_len >>
                                                                (((char)body_start_14 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                              }
                                              local_e4 = 0;
                                              capacity_16 = ppStack_d28->off - capacity_14;
                                              body_start_16 = 1;
                                              local_e4 = ptls_buffer__do_pushv(ppStack_d28,"",1);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              sz_1 = ppStack_d28->off;
                                              local_dd8 = (*tls->ctx->cipher_suites)->hash->
                                                          digest_size;
                                              local_e4 = ptls_buffer_reserve(ppStack_d28,local_dd8);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              _body_size_16 =
                                                   ptls_iovec_init(ppStack_d28->base + capacity_14,
                                                                   capacity_16);
                                              local_e4 = calc_cookie_signature
                                                                   (tls,properties,ppStack_c40,
                                                                    _body_size_16,
                                                                    ppStack_d28->base +
                                                                    ppStack_d28->off);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              ppStack_d28->off = local_dd8 + ppStack_d28->off;
                                              body_size_13 = ppStack_d28->off - sz_1;
                                              if (body_start_16 == 0xffffffffffffffff) {
                                                local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                     (ppStack_d28,body_size_13);
                                                if (local_e4 != 0) goto LAB_0013504b;
                                              }
                                              else {
                                                if ((body_start_16 < 8) &&
                                                   ((ulong)(1L << ((byte)(body_start_16 << 3) & 0x3f
                                                                  )) <= body_size_13)) {
                                                  local_e4 = 0x20c;
                                                  goto LAB_0013504b;
                                                }
                                                for (; body_start_16 != 0;
                                                    body_start_16 = body_start_16 - 1) {
                                                  ppStack_d28->base[sz_1 - body_start_16] =
                                                       (uint8_t)(body_size_13 >>
                                                                (((char)body_start_16 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                              }
                                              local_e4 = 0;
                                              body_size_12 = ppStack_d28->off - tbs_start;
                                              if (body_start_13 == 0xffffffffffffffff) {
                                                local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                     (ppStack_d28,body_size_12);
                                                if (local_e4 != 0) goto LAB_0013504b;
                                              }
                                              else {
                                                if ((body_start_13 < 8) &&
                                                   ((ulong)(1L << ((byte)(body_start_13 << 3) & 0x3f
                                                                  )) <= body_size_12)) {
                                                  local_e4 = 0x20c;
                                                  goto LAB_0013504b;
                                                }
                                                for (; body_start_13 != 0;
                                                    body_start_13 = body_start_13 - 1) {
                                                  ppStack_d28->base[tbs_start - body_start_13] =
                                                       (uint8_t)(body_size_12 >>
                                                                (((char)body_start_13 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                              }
                                              local_e4 = 0;
                                              body_size_8 = ppStack_d28->off - capacity_13;
                                              if (body_start_12 == 0xffffffffffffffff) {
                                                local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                     (ppStack_d28,body_size_8);
                                                if (local_e4 != 0) goto LAB_0013504b;
                                              }
                                              else {
                                                if ((body_start_12 < 8) &&
                                                   ((ulong)(1L << ((byte)(body_start_12 << 3) & 0x3f
                                                                  )) <= body_size_8)) {
                                                  local_e4 = 0x20c;
                                                  goto LAB_0013504b;
                                                }
                                                for (; body_start_12 != 0;
                                                    body_start_12 = body_start_12 - 1) {
                                                  ppStack_d28->base[capacity_13 - body_start_12] =
                                                       (uint8_t)(body_size_8 >>
                                                                (((char)body_start_12 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                              }
                                              local_e4 = 0;
                                            }
                                            body_size_6 = emitter->buf->off - sStack_cc8;
                                            if (body_start_8 == 0xffffffffffffffff) {
                                              local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                   (emitter->buf,body_size_6);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              local_e4 = 0;
                                            }
                                            else {
                                              if ((body_start_8 < 8) &&
                                                 ((ulong)(1L << ((byte)(body_start_8 << 3) & 0x3f))
                                                  <= body_size_6)) {
                                                local_e4 = 0x20c;
                                                goto LAB_0013504b;
                                              }
                                              for (; body_start_8 != 0;
                                                  body_start_8 = body_start_8 - 1) {
                                                emitter->buf->base[sStack_cc8 - body_start_8] =
                                                     (uint8_t)(body_size_6 >>
                                                              (((char)body_start_8 + -1) * '\b' &
                                                              0x3fU));
                                              }
                                            }
                                            local_e10 = *(long *)(_key_sched_1->secret + 0xc) -
                                                        lStack_c90;
                                            if (body_start_6 == 0xffffffffffffffff) {
                                              local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                   ((ptls_buffer_t *)_key_sched_1,
                                                                    local_e10);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              local_e4 = 0;
                                            }
                                            else {
                                              if ((body_start_6 < 8) &&
                                                 ((ulong)(1L << ((byte)(body_start_6 << 3) & 0x3f))
                                                  <= local_e10)) {
                                                local_e4 = 0x20c;
                                                goto LAB_0013504b;
                                              }
                                              for (; body_start_6 != 0;
                                                  body_start_6 = body_start_6 - 1) {
                                                *(char *)(*(long *)_key_sched_1 +
                                                         (lStack_c90 - body_start_6)) =
                                                     (char)(local_e10 >>
                                                           (((char)body_start_6 + -1) * '\b' & 0x3fU
                                                           ));
                                              }
                                            }
                                            if (mess_start_1 != 0) {
                                              ptls__key_schedule_update_hash
                                                        ((ptls_key_schedule_t *)mess_start_1,
                                                         (uint8_t *)
                                                         (*(long *)_key_sched_1 + local_c78),
                                                         *(long *)(_key_sched_1->secret + 0xc) -
                                                         local_c78,0);
                                            }
                                            local_e4 = (*(code *)_buf_1[1].base)(_buf_1);
                                            if (local_e4 == 0) {
                                              iVar8 = 0;
                                              if (sh_start_off_1 != 0) {
                                                ppVar12 = tls->key_schedule;
                                                puVar13 = emitter->buf->base + sh_start_off_1;
                                                local_e20 = ptls_iovec_init((uint8_t *)
                                                                            ((long)&_emitter_1->buf
                                                                            + (long)emitter->buf->
                                                                                    base),
                                                                            emitter->buf->off -
                                                                            (long)_emitter_1);
                                                local_e4 = ech_calc_confirmation
                                                                     (ppVar12,puVar13,
                                                                      (tls->ech).inner_client_random
                                                                      ,"hrr ech accept confirmation"
                                                                      ,local_e20);
                                                iVar8 = local_e4;
                                                if (local_e4 != 0) goto LAB_0013504b;
                                              }
                                              local_e4 = iVar8;
                                              ptls__key_schedule_update_hash
                                                        (tls->key_schedule,
                                                         (uint8_t *)
                                                         ((long)&_emitter_1->buf +
                                                         (long)emitter->buf->base),
                                                         emitter->buf->off - (long)_emitter_1,0);
                                              if (ech_confirm_off._4_4_ == 0) {
                                                tls->state = 
                                                PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                                if ((*(byte *)(key_share.peer_key.len + 0x30c) & 1)
                                                    != 0) {
                                                  (tls->field_19).server.early_data_skipped_bytes =
                                                       0;
                                                }
                                                local_e4 = 0x202;
                                              }
                                              else {
                                                local_e4 = push_change_cipher_spec(tls,emitter);
                                                if (local_e4 == 0) {
                                                  local_e4 = 0x206;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0013504b;
              }
            }
            else {
              hrr_start = (*tls->ctx->cipher_suites)->hash->digest_size;
              local_e4 = calc_cookie_signature
                                   (tls,properties,
                                    (ptls_key_exchange_algorithm_t *)ech.ch_inner._24_8_,
                                    *(ptls_iovec_t *)(key_share.peer_key.len + 0x1e0),
                                    (uint8_t *)&sigsize);
              if (local_e4 != 0) goto LAB_0013504b;
              if ((*(size_t *)(key_share.peer_key.len + 0x208) != hrr_start) ||
                 (iVar8 = (*ptls_mem_equal)(*(void **)(key_share.peer_key.len + 0x200),&sigsize,
                                            hrr_start), iVar8 == 0)) {
                local_e4 = 0x28;
                goto LAB_0013504b;
              }
              key_schedule_update_ch1hash_prefix(tls->key_schedule);
              ptls__key_schedule_update_hash
                        (tls->key_schedule,*(uint8_t **)(key_share.peer_key.len + 0x1f0),
                         *(size_t *)(key_share.peer_key.len + 0x1f8),0);
              key_schedule_extract(tls->key_schedule,(tls->ctx->pre_shared_key).secret);
              sh_start_off = emitter->buf->off;
              _buf = (ptls_buffer_t *)emitter;
              local_e4 = (*emitter->begin_message)(emitter);
              if (local_e4 != 0) goto LAB_0013504b;
              _key_sched = (ptls_key_schedule_t *)_buf->base;
              mess_start = 0;
              local_b60 = *(size_t *)(_key_sched->secret + 0xc);
              capacity._7_1_ = 2;
              local_e4 = ptls_buffer__do_pushv
                                   ((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
              if (local_e4 != 0) goto LAB_0013504b;
              body_start = 3;
              local_e4 = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
              if (local_e4 != 0) goto LAB_0013504b;
              lStack_b78 = *(long *)(_key_sched->secret + 0xc);
              _emitter = (ptls_message_emitter_t *)(emitter->buf->off - 4);
              capacity_1._6_2_ = 0x303;
              capacity_1._4_1_ = 3;
              capacity_1._5_1_ = 3;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_1 + 4),2);
              if ((local_e4 != 0) ||
                 (local_e4 = ptls_buffer_reserve(emitter->buf,0x20), local_e4 != 0))
              goto LAB_0013504b;
              puVar16 = emitter->buf->base;
              sVar11 = emitter->buf->off;
              puVar13 = puVar16 + sVar11;
              puVar13[0] = 0xcf;
              puVar13[1] = '!';
              puVar13[2] = 0xad;
              puVar13[3] = 't';
              puVar13[4] = 0xe5;
              puVar13[5] = 0x9a;
              puVar13[6] = 'a';
              puVar13[7] = '\x11';
              puVar13 = puVar16 + sVar11 + 8;
              puVar13[0] = 0xbe;
              puVar13[1] = '\x1d';
              puVar13[2] = 0x8c;
              puVar13[3] = '\x02';
              puVar13[4] = '\x1e';
              puVar13[5] = 'e';
              puVar13[6] = 0xb8;
              puVar13[7] = 0x91;
              puVar13 = puVar16 + sVar11 + 0x10;
              puVar13[0] = 0xc2;
              puVar13[1] = 0xa2;
              puVar13[2] = '\x11';
              puVar13[3] = '\x16';
              puVar13[4] = 'z';
              puVar13[5] = 0xbb;
              puVar13[6] = 0x8c;
              puVar13[7] = '^';
              puVar16 = puVar16 + sVar11 + 0x18;
              puVar16[0] = '\a';
              puVar16[1] = 0x9e;
              puVar16[2] = '\t';
              puVar16[3] = 0xe2;
              puVar16[4] = 200;
              puVar16[5] = 0xa8;
              puVar16[6] = '3';
              puVar16[7] = 0x9c;
              emitter->buf->off = emitter->buf->off + 0x20;
              body_start_1 = 1;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,"",1);
              if (local_e4 != 0) goto LAB_0013504b;
              body_size_1 = emitter->buf->off;
              local_e4 = ptls_buffer__do_pushv
                                   (emitter->buf,*(void **)(key_share.peer_key.len + 0x10),
                                    *(size_t *)(key_share.peer_key.len + 0x18));
              if (local_e4 != 0) goto LAB_0013504b;
              uStack_b98 = emitter->buf->off - body_size_1;
              if (body_start_1 == 0xffffffffffffffff) {
                local_e4 = ptls_buffer__adjust_quic_blocksize(emitter->buf,uStack_b98);
                if (local_e4 != 0) goto LAB_0013504b;
              }
              else {
                if ((body_start_1 < 8) &&
                   ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= uStack_b98)) {
                  local_e4 = 0x20c;
                  goto LAB_0013504b;
                }
                for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                  emitter->buf->base[body_size_1 - body_start_1] =
                       (uint8_t)(uStack_b98 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                }
              }
              local_e4 = 0;
              capacity_2._6_2_ = tls->cipher_suite->id;
              capacity_2._4_1_ = (undefined1)(capacity_2._6_2_ >> 8);
              capacity_2._5_1_ = (undefined1)capacity_2._6_2_;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_2 + 4),2);
              if (local_e4 != 0) goto LAB_0013504b;
              capacity_2._3_1_ = 0;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_2 + 3),1);
              if (local_e4 != 0) goto LAB_0013504b;
              body_start_2 = 2;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,"",2);
              if (local_e4 != 0) goto LAB_0013504b;
              sStack_bb0 = emitter->buf->off;
              capacity_3._6_2_ = 0x2b;
              capacity_3._4_1_ = 0;
              capacity_3._5_1_ = 0x2b;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_3 + 4),2);
              if (local_e4 != 0) goto LAB_0013504b;
              body_start_3 = 2;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,"",2);
              if (local_e4 != 0) goto LAB_0013504b;
              sStack_bc8 = emitter->buf->off;
              body_size_3._6_2_ = *(undefined2 *)(key_share.peer_key.len + 0x30);
              body_size_3._4_1_ = (undefined1)((ushort)body_size_3._6_2_ >> 8);
              body_size_3._5_1_ = (undefined1)body_size_3._6_2_;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&body_size_3 + 4),2);
              if (local_e4 != 0) goto LAB_0013504b;
              _negotiated_group = (ptls_key_exchange_algorithm_t *)(emitter->buf->off - sStack_bc8);
              if (body_start_3 == 0xffffffffffffffff) {
                local_e4 = ptls_buffer__adjust_quic_blocksize
                                     (emitter->buf,(size_t)_negotiated_group);
                if (local_e4 != 0) goto LAB_0013504b;
              }
              else {
                if ((body_start_3 < 8) &&
                   ((ptls_key_exchange_algorithm_t *)(1L << ((byte)(body_start_3 << 3) & 0x3f)) <=
                    _negotiated_group)) {
                  local_e4 = 0x20c;
                  goto LAB_0013504b;
                }
                for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
                  emitter->buf->base[sStack_bc8 - body_start_3] =
                       (uint8_t)((ulong)_negotiated_group >>
                                (((char)body_start_3 + -1) * '\b' & 0x3fU));
                }
              }
              local_e4 = 0;
              if ((*(byte *)(key_share.peer_key.len + 0x210) & 1) == 0) {
                local_12c8 = (undefined2 *)0x0;
              }
              else {
                local_12c8 = (undefined2 *)ech.ch_inner._24_8_;
              }
              puStack_be0 = local_12c8;
              if (local_12c8 != (undefined2 *)0x0) {
                capacity_4._6_2_ = 0x33;
                capacity_4._4_1_ = 0;
                capacity_4._5_1_ = 0x33;
                local_e4 = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_4 + 4),2);
                if (local_e4 != 0) goto LAB_0013504b;
                body_start_4 = 2;
                local_e4 = ptls_buffer__do_pushv(emitter->buf,"",2);
                if (local_e4 != 0) goto LAB_0013504b;
                sStack_bf8 = emitter->buf->off;
                body_size_4._6_2_ = *puStack_be0;
                body_size_4._4_1_ = (undefined1)((ushort)body_size_4._6_2_ >> 8);
                body_size_4._5_1_ = (undefined1)body_size_4._6_2_;
                local_e4 = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&body_size_4 + 4),2);
                if (local_e4 != 0) goto LAB_0013504b;
                uStack_c08 = emitter->buf->off - sStack_bf8;
                if (body_start_4 == 0xffffffffffffffff) {
                  local_e4 = ptls_buffer__adjust_quic_blocksize(emitter->buf,uStack_c08);
                  if (local_e4 != 0) goto LAB_0013504b;
                }
                else {
                  if ((body_start_4 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_4 << 3) & 0x3f)) <= uStack_c08)) {
                    local_e4 = 0x20c;
                    goto LAB_0013504b;
                  }
                  for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
                    emitter->buf->base[sStack_bf8 - body_start_4] =
                         (uint8_t)(uStack_c08 >> (((char)body_start_4 + -1) * '\b' & 0x3fU));
                  }
                }
              }
              local_e4 = 0;
              capacity_5._6_2_ = 0x2c;
              capacity_5._4_1_ = 0;
              capacity_5._5_1_ = 0x2c;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_5 + 4),2);
              if (local_e4 != 0) goto LAB_0013504b;
              body_start_5 = 2;
              local_e4 = ptls_buffer__do_pushv(emitter->buf,"",2);
              if (local_e4 != 0) goto LAB_0013504b;
              body_size_5 = emitter->buf->off;
              local_e4 = ptls_buffer__do_pushv
                                   (emitter->buf,*(void **)(key_share.peer_key.len + 0x1d0),
                                    *(size_t *)(key_share.peer_key.len + 0x1d8));
              if (local_e4 != 0) goto LAB_0013504b;
              body_size_2 = emitter->buf->off - body_size_5;
              if (body_start_5 == 0xffffffffffffffff) {
                local_e4 = ptls_buffer__adjust_quic_blocksize(emitter->buf,body_size_2);
                if (local_e4 != 0) goto LAB_0013504b;
              }
              else {
                if ((body_start_5 < 8) &&
                   ((ulong)(1L << ((byte)(body_start_5 << 3) & 0x3f)) <= body_size_2)) {
                  local_e4 = 0x20c;
                  goto LAB_0013504b;
                }
                for (; body_start_5 != 0; body_start_5 = body_start_5 - 1) {
                  emitter->buf->base[body_size_5 - body_start_5] =
                       (uint8_t)(body_size_2 >> (((char)body_start_5 + -1) * '\b' & 0x3fU));
                }
              }
              local_e4 = 0;
              body_size = emitter->buf->off - sStack_bb0;
              if (body_start_2 == 0xffffffffffffffff) {
                local_e4 = ptls_buffer__adjust_quic_blocksize(emitter->buf,body_size);
                if (local_e4 != 0) goto LAB_0013504b;
              }
              else {
                if ((body_start_2 < 8) &&
                   ((ulong)(1L << ((byte)(body_start_2 << 3) & 0x3f)) <= body_size)) {
                  local_e4 = 0x20c;
                  goto LAB_0013504b;
                }
                for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
                  emitter->buf->base[sStack_bb0 - body_start_2] =
                       (uint8_t)(body_size >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
                }
              }
              local_e4 = 0;
              negotiated_group =
                   (ptls_key_exchange_algorithm_t *)
                   (*(long *)(_key_sched->secret + 0xc) - lStack_b78);
              if (body_start == 0xffffffffffffffff) {
                local_e4 = ptls_buffer__adjust_quic_blocksize
                                     ((ptls_buffer_t *)_key_sched,(size_t)negotiated_group);
                if (local_e4 != 0) goto LAB_0013504b;
              }
              else {
                if ((body_start < 8) &&
                   ((ptls_key_exchange_algorithm_t *)(1L << ((byte)(body_start << 3) & 0x3f)) <=
                    negotiated_group)) {
                  local_e4 = 0x20c;
                  goto LAB_0013504b;
                }
                for (; body_start != 0; body_start = body_start - 1) {
                  *(char *)(*(long *)_key_sched + (lStack_b78 - body_start)) =
                       (char)((ulong)negotiated_group >> (((char)body_start + -1) * '\b' & 0x3fU));
                }
              }
              local_e4 = 0;
              if (mess_start != 0) {
                ptls__key_schedule_update_hash
                          ((ptls_key_schedule_t *)mess_start,
                           (uint8_t *)(*(long *)_key_sched + local_b60),
                           *(long *)(_key_sched->secret + 0xc) - local_b60,0);
              }
              local_e4 = (*(code *)_buf[1].base)(_buf);
              if (local_e4 != 0) goto LAB_0013504b;
              ptls__key_schedule_update_hash
                        (tls->key_schedule,
                         (uint8_t *)((long)&_emitter->buf + (long)emitter->buf->base),
                         emitter->buf->off - (long)_emitter,0);
              emitter->buf->off = sh_start_off;
              local_e0 = 1;
            }
          }
          local_e4 = report_unknown_extensions
                               (tls,properties,
                                (ptls_raw_extension_t *)(key_share.peer_key.len + 0x310));
          sVar11 = key_share.peer_key.len;
          if (local_e4 == 0) {
            if ((((*(long *)(key_share.peer_key.len + 600) != 0) &&
                 ((*(uint *)(key_share.peer_key.len + 0x308) & 3) != 0)) &&
                (((byte)tls->ctx->field_0xb8 >> 3 & 1) == 0)) &&
               (((local_e0 == 0 && (tls->ctx->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0)) ||
                ((tls->ctx->pre_shared_key).identity.base != (uint8_t *)0x0)))) {
              local_e30 = ptls_iovec_init(tls_local,
                                          *(long *)(key_share.peer_key.len + 600) - (long)tls_local)
              ;
              local_e4 = try_psk_handshake(tls,&pubkey.len,&ret,(st_ptls_client_hello_t *)sVar11,
                                           local_e30,local_e0);
              if (local_e4 != 0) goto LAB_0013504b;
            }
            local_e4 = 0;
            if (((tls->ctx->pre_shared_key).identity.base == (uint8_t *)0x0) ||
               (pubkey.len != 0xffffffffffffffff)) {
              if ((pubkey.len == 0xffffffffffffffff) || (((byte)tls->ctx->field_0xb8 >> 3 & 1) != 0)
                 ) {
                ptls__key_schedule_update_hash
                          (tls->key_schedule,(uint8_t *)tls_local,(size_t)message_local.base,0);
                if (local_e0 == 0) {
                  if (tls->key_schedule->generation != 0) {
                    __assert_fail("tls->key_schedule->generation == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                  ,0x1243,
                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                 );
                  }
                  ppVar12 = tls->key_schedule;
                  _selected = ptls_iovec_init((void *)0x0,0);
                  key_schedule_extract(ppVar12,_selected);
                }
                psk_index._4_4_ = 0;
                if (properties != (ptls_handshake_properties_t *)0x0) {
                  (properties->field_0).client.ech.retry_configs = (ptls_iovec_t *)0x0;
                }
              }
              else {
                ptls__key_schedule_update_hash
                          (tls->key_schedule,*(uint8_t **)(key_share.peer_key.len + 600),
                           (size_t)(message_local.base +
                                   (long)&tls_local->traffic_protection +
                                   (-0x58 - *(long *)(key_share.peer_key.len + 600))),0);
                if ((*(uint *)(key_share.peer_key.len + 0x308) & 1) == 0) {
                  if ((*(uint *)(key_share.peer_key.len + 0x308) & 2) == 0) {
                    __assert_fail("(ch->psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                  ,0x124e,
                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                 );
                  }
                  psk_index._4_4_ = 2;
                }
                else {
                  psk_index._4_4_ = 1;
                }
                tls->field_0x1e8 = tls->field_0x1e8 & 0xfd | 2;
                if (properties != (ptls_handshake_properties_t *)0x0) {
                  lVar14 = key_share.peer_key.len + pubkey.len * 0x28;
                  puStack_e48 = (undefined8 *)(lVar14 + 0x278);
                  memcpy(properties,(void *)*puStack_e48,*(size_t *)(lVar14 + 0x280));
                  (properties->field_0).client.ech.retry_configs = (ptls_iovec_t *)puStack_e48[1];
                }
              }
              if ((*(int *)(key_share.peer_key.len + 0x308) == 0) ||
                 (tls->ctx->ticket_lifetime == 0)) {
                (tls->field_19).server.num_tickets_to_send = '\0';
              }
              else {
                if (*(char *)(key_share.peer_key.len + 0x229) == '\0') {
                  (tls->field_19).server.num_tickets_to_send = '\x01';
                }
                else {
                  if (((byte)tls->field_0x1e8 >> 1 & 1) == 0) {
                    uVar6 = *(uint8_t *)(key_share.peer_key.len + 0x229);
                  }
                  else {
                    uVar6 = *(uint8_t *)(key_share.peer_key.len + 0x22a);
                  }
                  (tls->field_19).server.num_tickets_to_send = uVar6;
                }
                ech_confirm_off_1._7_1_ = (tls->ctx->ticket_requests).server.max_count;
                if (ech_confirm_off_1._7_1_ == 0) {
                  ech_confirm_off_1._7_1_ = 4;
                }
                if (ech_confirm_off_1._7_1_ < (tls->field_19).server.num_tickets_to_send) {
                  (tls->field_19).server.num_tickets_to_send = ech_confirm_off_1._7_1_;
                }
              }
              if (((ret != 0) && (tls->ctx->max_early_data_size != 0)) && (pubkey.len == 0)) {
                puVar13 = (uint8_t *)malloc(0x40);
                tls->pending_handshake_secret = puVar13;
                if (puVar13 == (uint8_t *)0x0) {
                  local_e4 = 0x201;
                  goto LAB_0013504b;
                }
                local_e4 = derive_exporter_secret(tls,1);
                if ((local_e4 != 0) ||
                   (local_e4 = setup_traffic_protection(tls,0,"c e traffic",1,0,0), local_e4 != 0))
                goto LAB_0013504b;
                local_e4 = 0;
              }
              if (psk_index._4_4_ != 1) {
                if (ech.ch_inner._24_8_ == 0) {
                  local_e4 = 0x6d;
                  if (*(long *)(key_share.peer_key.len + 0x58) != 0) {
                    local_e4 = 0x28;
                  }
                  goto LAB_0013504b;
                }
                local_e4 = (**(code **)(ech.ch_inner._24_8_ + 0x10))
                                     (ech.ch_inner._24_8_,&ecdh_secret.len,&is_second_flight,
                                      key_share.algorithm,key_share.peer_key.base);
                if (local_e4 != 0) {
                  if (ecdh_secret.len != 0) {
                    __assert_fail("pubkey.base == NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                  ,0x127c,
                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                 );
                  }
                  if (_is_second_flight != (uint8_t *)0x0) {
                    __assert_fail("ecdh_secret.base == NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                  ,0x127d,
                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                 );
                  }
                  goto LAB_0013504b;
                }
                tls->key_share = (ptls_key_exchange_algorithm_t *)ech.ch_inner._24_8_;
                local_e4 = 0;
              }
              sh_start_off_2 = 0;
              _buf_2 = (ptls_buffer_t *)emitter;
              local_e4 = (*emitter->begin_message)(emitter);
              if (local_e4 == 0) {
                _key_sched_2 = (ptls_key_schedule_t *)_buf_2->base;
                mess_start_2 = 0;
                local_e80 = *(size_t *)(_key_sched_2->secret + 0xc);
                capacity_17._7_1_ = 2;
                local_e4 = ptls_buffer__do_pushv
                                     ((ptls_buffer_t *)_key_sched_2,(void *)((long)&capacity_17 + 7)
                                      ,1);
                if (local_e4 == 0) {
                  body_start_17 = 3;
                  local_e4 = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_2,"",3);
                  if (local_e4 == 0) {
                    lStack_e98 = *(long *)(_key_sched_2->secret + 0xc);
                    _emitter_2 = (ptls_message_emitter_t *)(emitter->buf->off - 4);
                    capacity_18._6_2_ = 0x303;
                    capacity_18._4_1_ = 3;
                    capacity_18._5_1_ = 3;
                    local_e4 = ptls_buffer__do_pushv
                                         (emitter->buf,(void *)((long)&capacity_18 + 4),2);
                    if ((local_e4 == 0) &&
                       (local_e4 = ptls_buffer_reserve(emitter->buf,0x20), local_e4 == 0)) {
                      (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
                      iVar8 = ptls_is_ech_handshake
                                        (tls,(uint8_t *)0x0,(ptls_hpke_kem_t **)0x0,
                                         (ptls_hpke_cipher_suite_t **)0x0);
                      if (iVar8 != 0) {
                        sh_start_off_2 = emitter->buf->off + 0x18;
                        memset(emitter->buf->base + sh_start_off_2,0,8);
                      }
                      emitter->buf->off = emitter->buf->off + 0x20;
                      body_start_18 = 1;
                      local_e4 = ptls_buffer__do_pushv(emitter->buf,"",1);
                      if (local_e4 == 0) {
                        body_size_18 = emitter->buf->off;
                        local_e4 = ptls_buffer__do_pushv
                                             (emitter->buf,*(void **)(key_share.peer_key.len + 0x10)
                                              ,*(size_t *)(key_share.peer_key.len + 0x18));
                        if (local_e4 == 0) {
                          uStack_eb8 = emitter->buf->off - body_size_18;
                          if (body_start_18 == 0xffffffffffffffff) {
                            local_e4 = ptls_buffer__adjust_quic_blocksize(emitter->buf,uStack_eb8);
                            if (local_e4 != 0) goto LAB_0013504b;
                          }
                          else {
                            if ((body_start_18 < 8) &&
                               ((ulong)(1L << ((byte)(body_start_18 << 3) & 0x3f)) <= uStack_eb8)) {
                              local_e4 = 0x20c;
                              goto LAB_0013504b;
                            }
                            for (; body_start_18 != 0; body_start_18 = body_start_18 - 1) {
                              emitter->buf->base[body_size_18 - body_start_18] =
                                   (uint8_t)(uStack_eb8 >>
                                            (((char)body_start_18 + -1) * '\b' & 0x3fU));
                            }
                          }
                          local_e4 = 0;
                          capacity_19._6_2_ = tls->cipher_suite->id;
                          capacity_19._4_1_ = (undefined1)(capacity_19._6_2_ >> 8);
                          capacity_19._5_1_ = (undefined1)capacity_19._6_2_;
                          local_e4 = ptls_buffer__do_pushv
                                               (emitter->buf,(void *)((long)&capacity_19 + 4),2);
                          if (local_e4 == 0) {
                            capacity_19._3_1_ = 0;
                            local_e4 = ptls_buffer__do_pushv
                                                 (emitter->buf,(void *)((long)&capacity_19 + 3),1);
                            if (local_e4 == 0) {
                              body_start_19 = 2;
                              local_e4 = ptls_buffer__do_pushv(emitter->buf,"",2);
                              if (local_e4 == 0) {
                                sStack_ed0 = emitter->buf->off;
                                capacity_20._6_2_ = 0x2b;
                                capacity_20._4_1_ = 0;
                                capacity_20._5_1_ = 0x2b;
                                local_e4 = ptls_buffer__do_pushv
                                                     (emitter->buf,(void *)((long)&capacity_20 + 4),
                                                      2);
                                if (local_e4 == 0) {
                                  body_start_20 = 2;
                                  local_e4 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                  if (local_e4 == 0) {
                                    sStack_ee8 = emitter->buf->off;
                                    body_size_20._6_2_ =
                                         *(undefined2 *)(key_share.peer_key.len + 0x30);
                                    body_size_20._4_1_ =
                                         (undefined1)((ushort)body_size_20._6_2_ >> 8);
                                    body_size_20._5_1_ = (undefined1)body_size_20._6_2_;
                                    local_e4 = ptls_buffer__do_pushv
                                                         (emitter->buf,
                                                          (void *)((long)&body_size_20 + 4),2);
                                    if (local_e4 == 0) {
                                      sendbuf_1 = (ptls_buffer_t *)(emitter->buf->off - sStack_ee8);
                                      if (body_start_20 == 0xffffffffffffffff) {
                                        local_e4 = ptls_buffer__adjust_quic_blocksize
                                                             (emitter->buf,(size_t)sendbuf_1);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                      }
                                      else {
                                        if ((body_start_20 < 8) &&
                                           ((ptls_buffer_t *)
                                            (1L << ((byte)(body_start_20 << 3) & 0x3f)) <= sendbuf_1
                                           )) {
                                          local_e4 = 0x20c;
                                          goto LAB_0013504b;
                                        }
                                        for (; body_start_20 != 0; body_start_20 = body_start_20 - 1
                                            ) {
                                          emitter->buf->base[sStack_ee8 - body_start_20] =
                                               (uint8_t)((ulong)sendbuf_1 >>
                                                        (((char)body_start_20 + -1) * '\b' & 0x3fU))
                                          ;
                                        }
                                      }
                                      local_e4 = 0;
                                      ppStack_f00 = emitter->buf;
                                      if (psk_index._4_4_ != 1) {
                                        capacity_21._6_2_ = 0x33;
                                        capacity_21._4_1_ = 0;
                                        capacity_21._5_1_ = 0x33;
                                        local_e4 = ptls_buffer__do_pushv
                                                             (ppStack_f00,
                                                              (void *)((long)&capacity_21 + 4),2);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                        body_start_21 = 2;
                                        local_e4 = ptls_buffer__do_pushv(ppStack_f00,"",2);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                        sStack_f18 = ppStack_f00->off;
                                        capacity_22._6_2_ = *(undefined2 *)ech.ch_inner._24_8_;
                                        capacity_22._4_1_ =
                                             (undefined1)((ushort)capacity_22._6_2_ >> 8);
                                        capacity_22._5_1_ = (undefined1)capacity_22._6_2_;
                                        local_e4 = ptls_buffer__do_pushv
                                                             (ppStack_f00,
                                                              (void *)((long)&capacity_22 + 4),2);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                        body_start_22 = 2;
                                        local_e4 = ptls_buffer__do_pushv(ppStack_f00,"",2);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                        body_size_22 = ppStack_f00->off;
                                        local_e4 = ptls_buffer__do_pushv
                                                             (ppStack_f00,(void *)ecdh_secret.len,
                                                              (size_t)pubkey.base);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                        body_size_21 = ppStack_f00->off - body_size_22;
                                        if (body_start_22 == 0xffffffffffffffff) {
                                          local_e4 = ptls_buffer__adjust_quic_blocksize
                                                               (ppStack_f00,body_size_21);
                                          if (local_e4 != 0) goto LAB_0013504b;
                                        }
                                        else {
                                          if ((body_start_22 < 8) &&
                                             ((ulong)(1L << ((byte)(body_start_22 << 3) & 0x3f)) <=
                                              body_size_21)) {
                                            local_e4 = 0x20c;
                                            goto LAB_0013504b;
                                          }
                                          for (; body_start_22 != 0;
                                              body_start_22 = body_start_22 - 1) {
                                            ppStack_f00->base[body_size_22 - body_start_22] =
                                                 (uint8_t)(body_size_21 >>
                                                          (((char)body_start_22 + -1) * '\b' & 0x3fU
                                                          ));
                                          }
                                        }
                                        local_e4 = 0;
                                        uStack_f40 = ppStack_f00->off - sStack_f18;
                                        if (body_start_21 == 0xffffffffffffffff) {
                                          local_e4 = ptls_buffer__adjust_quic_blocksize
                                                               (ppStack_f00,uStack_f40);
                                          if (local_e4 != 0) goto LAB_0013504b;
                                        }
                                        else {
                                          if ((body_start_21 < 8) &&
                                             ((ulong)(1L << ((byte)(body_start_21 << 3) & 0x3f)) <=
                                              uStack_f40)) {
                                            local_e4 = 0x20c;
                                            goto LAB_0013504b;
                                          }
                                          for (; body_start_21 != 0;
                                              body_start_21 = body_start_21 - 1) {
                                            ppStack_f00->base[sStack_f18 - body_start_21] =
                                                 (uint8_t)(uStack_f40 >>
                                                          (((char)body_start_21 + -1) * '\b' & 0x3fU
                                                          ));
                                          }
                                        }
                                      }
                                      local_e4 = 0;
                                      if (psk_index._4_4_ != 0) {
                                        capacity_23._6_2_ = 0x29;
                                        capacity_23._4_1_ = 0;
                                        capacity_23._5_1_ = 0x29;
                                        local_e4 = ptls_buffer__do_pushv
                                                             (ppStack_f00,
                                                              (void *)((long)&capacity_23 + 4),2);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                        body_start_23 = 2;
                                        local_e4 = ptls_buffer__do_pushv(ppStack_f00,"",2);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                        sStack_f58 = ppStack_f00->off;
                                        body_size_23._6_2_ = (undefined2)pubkey.len;
                                        body_size_23._4_1_ = (undefined1)(pubkey.len >> 8);
                                        body_size_23._5_1_ = (undefined1)pubkey.len;
                                        local_e4 = ptls_buffer__do_pushv
                                                             (ppStack_f00,
                                                              (void *)((long)&body_size_23 + 4),2);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                        body_size_19 = ppStack_f00->off - sStack_f58;
                                        if (body_start_23 == 0xffffffffffffffff) {
                                          local_e4 = ptls_buffer__adjust_quic_blocksize
                                                               (ppStack_f00,body_size_19);
                                          if (local_e4 != 0) goto LAB_0013504b;
                                        }
                                        else {
                                          if ((body_start_23 < 8) &&
                                             ((ulong)(1L << ((byte)(body_start_23 << 3) & 0x3f)) <=
                                              body_size_19)) {
                                            local_e4 = 0x20c;
                                            goto LAB_0013504b;
                                          }
                                          for (; body_start_23 != 0;
                                              body_start_23 = body_start_23 - 1) {
                                            ppStack_f00->base[sStack_f58 - body_start_23] =
                                                 (uint8_t)(body_size_19 >>
                                                          (((char)body_start_23 + -1) * '\b' & 0x3fU
                                                          ));
                                          }
                                        }
                                      }
                                      local_e4 = 0;
                                      body_size_17 = emitter->buf->off - sStack_ed0;
                                      if (body_start_19 == 0xffffffffffffffff) {
                                        local_e4 = ptls_buffer__adjust_quic_blocksize
                                                             (emitter->buf,body_size_17);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                      }
                                      else {
                                        if ((body_start_19 < 8) &&
                                           ((ulong)(1L << ((byte)(body_start_19 << 3) & 0x3f)) <=
                                            body_size_17)) {
                                          local_e4 = 0x20c;
                                          goto LAB_0013504b;
                                        }
                                        for (; body_start_19 != 0; body_start_19 = body_start_19 - 1
                                            ) {
                                          emitter->buf->base[sStack_ed0 - body_start_19] =
                                               (uint8_t)(body_size_17 >>
                                                        (((char)body_start_19 + -1) * '\b' & 0x3fU))
                                          ;
                                        }
                                      }
                                      local_e4 = 0;
                                      local_f78 = *(long *)(_key_sched_2->secret + 0xc) - lStack_e98
                                      ;
                                      if (body_start_17 == 0xffffffffffffffff) {
                                        local_e4 = ptls_buffer__adjust_quic_blocksize
                                                             ((ptls_buffer_t *)_key_sched_2,
                                                              local_f78);
                                        if (local_e4 != 0) goto LAB_0013504b;
                                      }
                                      else {
                                        if ((body_start_17 < 8) &&
                                           ((ulong)(1L << ((byte)(body_start_17 << 3) & 0x3f)) <=
                                            local_f78)) {
                                          local_e4 = 0x20c;
                                          goto LAB_0013504b;
                                        }
                                        for (; body_start_17 != 0; body_start_17 = body_start_17 - 1
                                            ) {
                                          *(char *)(*(long *)_key_sched_2 +
                                                   (lStack_e98 - body_start_17)) =
                                               (char)(local_f78 >>
                                                     (((char)body_start_17 + -1) * '\b' & 0x3fU));
                                        }
                                      }
                                      local_e4 = 0;
                                      if (mess_start_2 != 0) {
                                        ptls__key_schedule_update_hash
                                                  ((ptls_key_schedule_t *)mess_start_2,
                                                   (uint8_t *)(*(long *)_key_sched_2 + local_e80),
                                                   *(long *)(_key_sched_2->secret + 0xc) - local_e80
                                                   ,0);
                                      }
                                      local_e4 = (*(code *)_buf_2[1].base)(_buf_2);
                                      if (local_e4 == 0) {
                                        iVar8 = 0;
                                        if (sh_start_off_2 != 0) {
                                          ppVar12 = tls->key_schedule;
                                          puVar13 = emitter->buf->base + sh_start_off_2;
                                          __emitter_3 = ptls_iovec_init((uint8_t *)
                                                                        ((long)&_emitter_2->buf +
                                                                        (long)emitter->buf->base),
                                                                        emitter->buf->off -
                                                                        (long)_emitter_2);
                                          local_e4 = ech_calc_confirmation
                                                               (ppVar12,puVar13,
                                                                (tls->ech).inner_client_random,
                                                                "ech accept confirmation",
                                                                __emitter_3);
                                          iVar8 = local_e4;
                                          if (local_e4 != 0) goto LAB_0013504b;
                                        }
                                        local_e4 = iVar8;
                                        ptls__key_schedule_update_hash
                                                  (tls->key_schedule,
                                                   (uint8_t *)
                                                   ((long)&_emitter_2->buf +
                                                   (long)emitter->buf->base),
                                                   emitter->buf->off - (long)_emitter_2,0);
                                        clear_ech(&tls->ech,1);
                                        local_e4 = push_change_cipher_spec(tls,emitter);
                                        if (local_e4 == 0) {
                                          if (tls->key_schedule->generation != 1) {
                                            __assert_fail("tls->key_schedule->generation == 1",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                                  ,0x12ad,
                                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                                  );
                                          }
                                          ikm.len = (size_t)ecdh_secret.base;
                                          ikm.base = _is_second_flight;
                                          key_schedule_extract(tls->key_schedule,ikm);
                                          local_e4 = setup_traffic_protection
                                                               (tls,1,"s hs traffic",2,0,0);
                                          if (local_e4 == 0) {
                                            if (tls->pending_handshake_secret == (uint8_t *)0x0) {
                                              local_e4 = setup_traffic_protection
                                                                   (tls,0,"c hs traffic",2,0,0);
                                              if (local_e4 != 0) goto LAB_0013504b;
                                              if ((*(byte *)(key_share.peer_key.len + 0x30c) & 1) !=
                                                  0) {
                                                (tls->field_19).server.early_data_skipped_bytes = 0;
                                              }
                                              iVar8 = 0;
                                            }
                                            else {
                                              local_e4 = derive_secret(tls->key_schedule,
                                                                       tls->pending_handshake_secret
                                                                       ,"c hs traffic");
                                              if ((local_e4 != 0) ||
                                                 ((iVar8 = 0,
                                                  tls->ctx->update_traffic_key !=
                                                  (ptls_update_traffic_key_t *)0x0 &&
                                                  (local_e4 = (*tls->ctx->update_traffic_key->cb)
                                                                        (tls->ctx->
                                                                         update_traffic_key,tls,0,2,
                                                                         tls->
                                                  pending_handshake_secret), iVar8 = local_e4,
                                                  local_e4 != 0)))) goto LAB_0013504b;
                                            }
                                            local_e4 = iVar8;
                                            _buf_3 = (ptls_buffer_t *)emitter;
                                            local_e4 = (*emitter->begin_message)(emitter);
                                            if (local_e4 == 0) {
                                              _key_sched_3 = (ptls_key_schedule_t *)_buf_3->base;
                                              mess_start_3 = (size_t)tls->key_schedule;
                                              local_fa8 = *(size_t *)(_key_sched_3->secret + 0xc);
                                              capacity_24._7_1_ = 8;
                                              local_e4 = ptls_buffer__do_pushv
                                                                   ((ptls_buffer_t *)_key_sched_3,
                                                                    (void *)((long)&capacity_24 + 7)
                                                                    ,1);
                                              if (local_e4 == 0) {
                                                body_start_24 = 3;
                                                local_e4 = ptls_buffer__do_pushv
                                                                     ((ptls_buffer_t *)_key_sched_3,
                                                                      "",3);
                                                if (local_e4 == 0) {
                                                  sendbuf_2 = *(ptls_buffer_t **)
                                                               (_key_sched_3->secret + 0xc);
                                                  capacity_25 = (size_t)emitter->buf;
                                                  body_start_25 = 2;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,"",2);
                                                  if (local_e4 == 0) {
                                                    lStack_fd8 = *(long *)(capacity_25 + 0x10);
                                                    if (tls->server_name != (char *)0x0) {
                                                      capacity_26._6_2_ = 0;
                                                      capacity_26._4_1_ = 0;
                                                      capacity_26._5_1_ = 0;
                                                      local_e4 = ptls_buffer__do_pushv
                                                                           ((ptls_buffer_t *)
                                                                            capacity_25,
                                                                            (void *)((long)&
                                                  capacity_26 + 4),2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_26 = 2;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_size_26 = *(size_t *)(capacity_25 + 0x10);
                                                  uStack_ff8 = *(long *)(capacity_25 + 0x10) -
                                                               body_size_26;
                                                  if (body_start_26 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,uStack_ff8);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_26 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_26 << 3) &
                                                                      0x3f)) <= uStack_ff8)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_26 != 0;
                                                        body_start_26 = body_start_26 - 1) {
                                                      *(char *)(*(long *)capacity_25 +
                                                               (body_size_26 - body_start_26)) =
                                                           (char)(uStack_ff8 >>
                                                                 (((char)body_start_26 + -1) * '\b'
                                                                 & 0x3fU));
                                                    }
                                                  }
                                                  }
                                                  local_e4 = 0;
                                                  if (((byte)tls->ctx->field_0xb8 >> 5 & 1) != 0) {
                                                    capacity_27._6_2_ = 0x14;
                                                    capacity_27._4_1_ = 0;
                                                    capacity_27._5_1_ = 0x14;
                                                    local_e4 = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,
                                                                          (void *)((long)&
                                                  capacity_27 + 4),2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_27 = 2;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  local_1010 = *(long *)(capacity_25 + 0x10);
                                                  body_size_27._7_1_ = 2;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,(void *)((long)&
                                                  body_size_27 + 7),1);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  uStack_1020 = *(long *)(capacity_25 + 0x10) -
                                                                local_1010;
                                                  if (body_start_27 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,uStack_1020);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_27 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_27 << 3) &
                                                                      0x3f)) <= uStack_1020)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_27 != 0;
                                                        body_start_27 = body_start_27 - 1) {
                                                      *(char *)(*(long *)capacity_25 +
                                                               (local_1010 - body_start_27)) =
                                                           (char)(uStack_1020 >>
                                                                 (((char)body_start_27 + -1) * '\b'
                                                                 & 0x3fU));
                                                    }
                                                  }
                                                  }
                                                  local_e4 = 0;
                                                  if (tls->negotiated_protocol != (char *)0x0) {
                                                    capacity_28._6_2_ = 0x10;
                                                    capacity_28._4_1_ = 0;
                                                    capacity_28._5_1_ = 0x10;
                                                    local_e4 = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,
                                                                          (void *)((long)&
                                                  capacity_28 + 4),2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_28 = 2;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  capacity_29 = *(size_t *)(capacity_25 + 0x10);
                                                  body_start_29 = 2;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  capacity_30 = *(size_t *)(capacity_25 + 0x10);
                                                  body_start_30 = 1;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,"",1);
                                                  sVar11 = capacity_25;
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_size_30 = *(size_t *)(capacity_25 + 0x10);
                                                  src_00 = tls->negotiated_protocol;
                                                  len = strlen(tls->negotiated_protocol);
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)sVar11,
                                                                        src_00,len);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_size_29 = *(long *)(capacity_25 + 0x10) -
                                                                 body_size_30;
                                                  if (body_start_30 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,body_size_29);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_30 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_30 << 3) &
                                                                      0x3f)) <= body_size_29)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_30 != 0;
                                                        body_start_30 = body_start_30 - 1) {
                                                      *(char *)(*(long *)capacity_25 +
                                                               (body_size_30 - body_start_30)) =
                                                           (char)(body_size_29 >>
                                                                 (((char)body_start_30 + -1) * '\b'
                                                                 & 0x3fU));
                                                    }
                                                  }
                                                  local_e4 = 0;
                                                  body_size_28 = *(long *)(capacity_25 + 0x10) -
                                                                 capacity_30;
                                                  if (body_start_29 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,body_size_28);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_29 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_29 << 3) &
                                                                      0x3f)) <= body_size_28)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_29 != 0;
                                                        body_start_29 = body_start_29 - 1) {
                                                      *(char *)(*(long *)capacity_25 +
                                                               (capacity_30 - body_start_29)) =
                                                           (char)(body_size_28 >>
                                                                 (((char)body_start_29 + -1) * '\b'
                                                                 & 0x3fU));
                                                    }
                                                  }
                                                  local_e4 = 0;
                                                  uStack_1070 = *(long *)(capacity_25 + 0x10) -
                                                                capacity_29;
                                                  if (body_start_28 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,uStack_1070);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_28 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_28 << 3) &
                                                                      0x3f)) <= uStack_1070)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_28 != 0;
                                                        body_start_28 = body_start_28 - 1) {
                                                      *(char *)(*(long *)capacity_25 +
                                                               (capacity_29 - body_start_28)) =
                                                           (char)(uStack_1070 >>
                                                                 (((char)body_start_28 + -1) * '\b'
                                                                 & 0x3fU));
                                                    }
                                                  }
                                                  }
                                                  local_e4 = 0;
                                                  if (tls->pending_handshake_secret !=
                                                      (uint8_t *)0x0) {
                                                    capacity_31._6_2_ = 0x2a;
                                                    capacity_31._4_1_ = 0;
                                                    capacity_31._5_1_ = 0x2a;
                                                    local_e4 = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,
                                                                          (void *)((long)&
                                                  capacity_31 + 4),2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_31 = 2;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_size_31 = *(size_t *)(capacity_25 + 0x10);
                                                  uStack_1090 = *(long *)(capacity_25 + 0x10) -
                                                                body_size_31;
                                                  if (body_start_31 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,uStack_1090);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_31 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_31 << 3) &
                                                                      0x3f)) <= uStack_1090)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_31 != 0;
                                                        body_start_31 = body_start_31 - 1) {
                                                      *(char *)(*(long *)capacity_25 +
                                                               (body_size_31 - body_start_31)) =
                                                           (char)(uStack_1090 >>
                                                                 (((char)body_start_31 + -1) * '\b'
                                                                 & 0x3fU));
                                                    }
                                                  }
                                                  }
                                                  local_e4 = 0;
                                                  if (((((undefined1  [112])
                                                         ((undefined1  [112])tls->ech &
                                                         (undefined1  [112])0x1) !=
                                                         (undefined1  [112])0x0) &&
                                                       (iVar8 = ptls_is_ech_handshake
                                                                          (tls,(uint8_t *)0x0,
                                                                           (ptls_hpke_kem_t **)0x0,
                                                                           (ptls_hpke_cipher_suite_t
                                                                            **)0x0), iVar8 == 0)) &&
                                                      ((tls->ctx->ech).server.create_opener !=
                                                       (ptls_ech_create_opener_t *)0x0)) &&
                                                     ((tls->ctx->ech).server.retry_configs.len != 0)
                                                     ) {
                                                    capacity_32._6_2_ = 0xfe0d;
                                                    capacity_32._4_1_ = 0xfe;
                                                    capacity_32._5_1_ = 0xd;
                                                    local_e4 = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,
                                                                          (void *)((long)&
                                                  capacity_32 + 4),2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_32 = 2;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_size_32 = *(size_t *)(capacity_25 + 0x10);
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,(tls->ctx->ech).server.
                                                                         retry_configs.base,
                                                                        (tls->ctx->ech).server.
                                                                        retry_configs.len);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  uStack_10b0 = *(long *)(capacity_25 + 0x10) -
                                                                body_size_32;
                                                  if (body_start_32 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,uStack_10b0);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_32 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_32 << 3) &
                                                                      0x3f)) <= uStack_10b0)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_32 != 0;
                                                        body_start_32 = body_start_32 - 1) {
                                                      *(char *)(*(long *)capacity_25 +
                                                               (body_size_32 - body_start_32)) =
                                                           (char)(uStack_10b0 >>
                                                                 (((char)body_start_32 + -1) * '\b'
                                                                 & 0x3fU));
                                                    }
                                                  }
                                                  local_e4 = 0;
                                                  }
                                                  if ((*(char *)(key_share.peer_key.len + 0x229) !=
                                                       '\0') &&
                                                     ((tls->field_19).server.num_tickets_to_send !=
                                                      '\0')) {
                                                    capacity_33._6_2_ = 0x3a;
                                                    capacity_33._4_1_ = 0;
                                                    capacity_33._5_1_ = 0x3a;
                                                    local_e4 = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,
                                                                          (void *)((long)&
                                                  capacity_33 + 4),2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_33 = 2;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  local_10c8 = *(long *)(capacity_25 + 0x10);
                                                  body_size_33._7_1_ =
                                                       (tls->field_19).server.num_tickets_to_send;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)capacity_25
                                                                        ,(void *)((long)&
                                                  body_size_33 + 7),1);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_size_25 = *(long *)(capacity_25 + 0x10) -
                                                                 local_10c8;
                                                  if (body_start_33 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          capacity_25,body_size_25);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_33 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_33 << 3) &
                                                                      0x3f)) <= body_size_25)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_33 != 0;
                                                        body_start_33 = body_start_33 - 1) {
                                                      *(char *)(*(long *)capacity_25 +
                                                               (local_10c8 - body_start_33)) =
                                                           (char)(body_size_25 >>
                                                                 (((char)body_start_33 + -1) * '\b'
                                                                 & 0x3fU));
                                                    }
                                                  }
                                                  local_e4 = 0;
                                                  }
                                                  local_e4 = push_additional_extensions
                                                                       (properties,
                                                                        (ptls_buffer_t *)capacity_25
                                                                       );
                                                  if (local_e4 == 0) {
                                                    body_size_24 = *(long *)(capacity_25 + 0x10) -
                                                                   lStack_fd8;
                                                    if (body_start_25 == 0xffffffffffffffff) {
                                                      local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                           ((ptls_buffer_t *)
                                                                            capacity_25,body_size_24
                                                                           );
                                                      if (local_e4 != 0) goto LAB_0013504b;
                                                    }
                                                    else {
                                                      if ((body_start_25 < 8) &&
                                                         ((ulong)(1L << ((byte)(body_start_25 << 3)
                                                                        & 0x3f)) <= body_size_24)) {
                                                        local_e4 = 0x20c;
                                                        goto LAB_0013504b;
                                                      }
                                                      for (; body_start_25 != 0;
                                                          body_start_25 = body_start_25 - 1) {
                                                        *(char *)(*(long *)capacity_25 +
                                                                 (lStack_fd8 - body_start_25)) =
                                                             (char)(body_size_24 >>
                                                                   (((char)body_start_25 + -1) *
                                                                    '\b' & 0x3fU));
                                                      }
                                                    }
                                                    local_e4 = 0;
                                                    _emitter_4 = (ptls_message_emitter_t *)
                                                                 (*(long *)(_key_sched_3->secret +
                                                                           0xc) - (long)sendbuf_2);
                                                    if (body_start_24 == 0xffffffffffffffff) {
                                                      local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                           ((ptls_buffer_t *)
                                                                            _key_sched_3,
                                                                            (size_t)_emitter_4);
                                                      if (local_e4 != 0) goto LAB_0013504b;
                                                    }
                                                    else {
                                                      if ((body_start_24 < 8) &&
                                                         ((ptls_message_emitter_t *)
                                                          (1L << ((byte)(body_start_24 << 3) & 0x3f)
                                                          ) <= _emitter_4)) {
                                                        local_e4 = 0x20c;
                                                        goto LAB_0013504b;
                                                      }
                                                      for (; body_start_24 != 0;
                                                          body_start_24 = body_start_24 - 1) {
                                                        *(char *)((long)sendbuf_2 +
                                                                 (*(long *)_key_sched_3 -
                                                                 body_start_24)) =
                                                             (char)((ulong)_emitter_4 >>
                                                                   (((char)body_start_24 + -1) *
                                                                    '\b' & 0x3fU));
                                                      }
                                                    }
                                                    local_e4 = 0;
                                                    if (mess_start_3 != 0) {
                                                      ptls__key_schedule_update_hash
                                                                ((ptls_key_schedule_t *)mess_start_3
                                                                 ,(uint8_t *)
                                                                  (*(long *)_key_sched_3 + local_fa8
                                                                  ),*(long *)(_key_sched_3->secret +
                                                                             0xc) - local_fa8,0);
                                                    }
                                                    local_e4 = (*(code *)_buf_3[1].base)(_buf_3);
                                                    if (local_e4 == 0) {
                                                      if (psk_index._4_4_ == 0) {
                                                        if (((byte)tls->ctx->field_0xb8 >> 3 & 1) !=
                                                            0) {
                                                          _buf_4 = (ptls_buffer_t *)emitter;
                                                          local_e4 = (*emitter->begin_message)
                                                                               (emitter);
                                                          if (local_e4 != 0) goto LAB_0013504b;
                                                          _key_sched_4 = (ptls_key_schedule_t *)
                                                                         _buf_4->base;
                                                          mess_start_4 = (size_t)tls->key_schedule;
                                                          local_1108 = *(size_t *)
                                                                        (_key_sched_4->secret + 0xc)
                                                          ;
                                                          capacity_34._7_1_ = 0xd;
                                                          local_e4 = ptls_buffer__do_pushv
                                                                               ((ptls_buffer_t *)
                                                                                _key_sched_4,
                                                                                (void *)((long)&
                                                  capacity_34 + 7),1);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_34 = 3;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)
                                                                        _key_sched_4,"",3);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  sendbuf_3 = *(ptls_buffer_t **)
                                                               (_key_sched_4->secret + 0xc);
                                                  local_1128 = emitter->buf;
                                                  capacity_35._7_1_ = 0;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       (local_1128,
                                                                        (void *)((long)&capacity_35
                                                                                + 7),1);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_35 = 2;
                                                  local_e4 = ptls_buffer__do_pushv(local_1128,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  sStack_1140 = local_1128->off;
                                                  capacity_36._6_2_ = 0xd;
                                                  capacity_36._4_1_ = 0;
                                                  capacity_36._5_1_ = 0xd;
                                                  local_e4 = ptls_buffer__do_pushv
                                                                       (local_1128,
                                                                        (void *)((long)&capacity_36
                                                                                + 4),2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_36 = 2;
                                                  local_e4 = ptls_buffer__do_pushv(local_1128,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_size_36 = local_1128->off;
                                                  local_e4 = push_signature_algorithms
                                                                       (tls->ctx->verify_certificate
                                                                        ,local_1128);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  uStack_1160 = local_1128->off - body_size_36;
                                                  if (body_start_36 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         (local_1128,uStack_1160);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_36 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_36 << 3) &
                                                                      0x3f)) <= uStack_1160)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_36 != 0;
                                                        body_start_36 = body_start_36 - 1) {
                                                      local_1128->base[body_size_36 - body_start_36]
                                                           = (uint8_t)(uStack_1160 >>
                                                                      (((char)body_start_36 + -1) *
                                                                       '\b' & 0x3fU));
                                                    }
                                                  }
                                                  local_e4 = 0;
                                                  if ((tls->ctx->client_ca_names).count != 0) {
                                                    capacity_37._6_2_ = 0x2f;
                                                    capacity_37._4_1_ = 0;
                                                    capacity_37._5_1_ = 0x2f;
                                                    local_e4 = ptls_buffer__do_pushv
                                                                         (local_1128,
                                                                          (void *)((long)&
                                                  capacity_37 + 4),2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  body_start_37 = 2;
                                                  local_e4 = ptls_buffer__do_pushv(local_1128,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  sVar11 = local_1128->off;
                                                  body_start_38 = 2;
                                                  local_e4 = ptls_buffer__do_pushv(local_1128,"",2);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  sVar4 = local_1128->off;
                                                  for (capacity_39 = 0; local_e4 = 0,
                                                      capacity_39 !=
                                                      (tls->ctx->client_ca_names).count;
                                                      capacity_39 = capacity_39 + 1) {
                                                    body_start_39 = 2;
                                                    local_e4 = ptls_buffer__do_pushv
                                                                         (local_1128,"",2);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                    sVar5 = local_1128->off;
                                                    ppVar9 = (tls->ctx->client_ca_names).list +
                                                             capacity_39;
                                                    local_e4 = ptls_buffer__do_pushv
                                                                         (local_1128,ppVar9->base,
                                                                          ppVar9->len);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                    uVar15 = local_1128->off - sVar5;
                                                    if (0xffff < uVar15) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_39 != 0;
                                                        body_start_39 = body_start_39 - 1) {
                                                      local_1128->base[sVar5 - body_start_39] =
                                                           (uint8_t)(uVar15 >>
                                                                    (((char)body_start_39 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                  }
                                                  uVar15 = local_1128->off - sVar4;
                                                  if (0xffff < uVar15) {
                                                    local_e4 = 0x20c;
                                                    goto LAB_0013504b;
                                                  }
                                                  for (; body_start_38 != 0;
                                                      body_start_38 = body_start_38 - 1) {
                                                    local_1128->base[sVar4 - body_start_38] =
                                                         (uint8_t)(uVar15 >>
                                                                  (((char)body_start_38 + -1) * '\b'
                                                                  & 0x3fU));
                                                  }
                                                  uVar15 = local_1128->off - sVar11;
                                                  if (0xffff < uVar15) {
                                                    local_e4 = 0x20c;
                                                    goto LAB_0013504b;
                                                  }
                                                  for (; body_start_37 != 0;
                                                      body_start_37 = body_start_37 - 1) {
                                                    local_1128->base[sVar11 - body_start_37] =
                                                         (uint8_t)(uVar15 >>
                                                                  (((char)body_start_37 + -1) * '\b'
                                                                  & 0x3fU));
                                                  }
                                                  }
                                                  local_e4 = 0;
                                                  uVar15 = local_1128->off - sStack_1140;
                                                  if (body_start_35 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         (local_1128,uVar15);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_35 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_35 << 3) &
                                                                      0x3f)) <= uVar15)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_35 != 0;
                                                        body_start_35 = body_start_35 - 1) {
                                                      local_1128->base[sStack_1140 - body_start_35]
                                                           = (uint8_t)(uVar15 >>
                                                                      (((char)body_start_35 + -1) *
                                                                       '\b' & 0x3fU));
                                                    }
                                                  }
                                                  local_e4 = 0;
                                                  uVar15 = *(long *)(_key_sched_4->secret + 0xc) -
                                                           (long)sendbuf_3;
                                                  if (body_start_34 == 0xffffffffffffffff) {
                                                    local_e4 = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          _key_sched_4,uVar15);
                                                    if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  else {
                                                    if ((body_start_34 < 8) &&
                                                       ((ulong)(1L << ((byte)(body_start_34 << 3) &
                                                                      0x3f)) <= uVar15)) {
                                                      local_e4 = 0x20c;
                                                      goto LAB_0013504b;
                                                    }
                                                    for (; body_start_34 != 0;
                                                        body_start_34 = body_start_34 - 1) {
                                                      *(char *)((long)sendbuf_3 +
                                                               (*(long *)_key_sched_4 -
                                                               body_start_34)) =
                                                           (char)(uVar15 >>
                                                                 (((char)body_start_34 + -1) * '\b'
                                                                 & 0x3fU));
                                                    }
                                                  }
                                                  local_e4 = 0;
                                                  if (mess_start_4 != 0) {
                                                    ptls__key_schedule_update_hash
                                                              ((ptls_key_schedule_t *)mess_start_4,
                                                               (uint8_t *)
                                                               (*(long *)_key_sched_4 + local_1108),
                                                               *(long *)(_key_sched_4->secret + 0xc)
                                                               - local_1108,0);
                                                  }
                                                  local_e4 = (*(code *)_buf_4[1].base)(_buf_4);
                                                  if (local_e4 != 0) goto LAB_0013504b;
                                                  }
                                                  local_e4 = 0;
                                                  signature_algorithms =
                                                       (st_ptls_signature_algorithms_t *)
                                                       (key_share.peer_key.len + 0x68);
                                                  pVar17 = ptls_iovec_init((void *)0x0,0);
                                                  local_e4 = send_certificate(tls,emitter,
                                                                              signature_algorithms,
                                                                              pVar17,(uint)(*(byte *
                                                  )(key_share.peer_key.len + 0x228) & 1),
                                                  (uint16_t *)(key_share.peer_key.len + 0x1a8),
                                                  *(size_t *)(key_share.peer_key.len + 0x1c8));
                                                  if (local_e4 == 0) {
                                                    local_e4 = server_finish_handshake
                                                                         (tls,emitter,1,
                                                                          (
                                                  st_ptls_signature_algorithms_t *)
                                                  (key_share.peer_key.len + 0x68));
                                                  }
                                                  }
                                                  else {
                                                    local_e4 = server_finish_handshake
                                                                         (tls,emitter,0,
                                                                          (
                                                  st_ptls_signature_algorithms_t *)0x0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              local_e4 = 0x73;
            }
          }
        }
      }
    }
  }
LAB_0013504b:
  free((void *)ecdh_secret.len);
  if (_is_second_flight != (uint8_t *)0x0) {
    (*ptls_clear_memory)(_is_second_flight,(size_t)ecdh_secret.base);
    free(_is_second_flight);
  }
  free(puStack_a8);
  free(ech.encoded_ch_inner);
  ptls_buffer_dispose((ptls_buffer_t *)&ech.ch_outer_aad);
  free((void *)key_share.peer_key.len);
  return local_e4;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions, post_action)                                                               \
    do {                                                                                                                           \
        size_t sh_start_off;                                                                                                       \
        ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                       \
            sh_start_off = emitter->buf->off - PTLS_HANDSHAKE_HEADER_SIZE;                                                         \
            ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                         \
            if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                            \
                goto Exit;                                                                                                         \
            do {                                                                                                                   \
                fill_rand                                                                                                          \
            } while (0);                                                                                                           \
            emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                           \
            ptls_buffer_push_block(emitter->buf, 1,                                                                                \
                                   { ptls_buffer_pushv(emitter->buf, ch->legacy_session_id.base, ch->legacy_session_id.len); });   \
            ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                               \
            ptls_buffer_push(emitter->buf, 0);                                                                                     \
            ptls_buffer_push_block(emitter->buf, 2, {                                                                              \
                buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                        \
                                      { ptls_buffer_push16(emitter->buf, ch->selected_version); });                                \
                do {                                                                                                               \
                    extensions                                                                                                     \
                } while (0);                                                                                                       \
            });                                                                                                                    \
        }